

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [12];
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  ulong uVar97;
  byte bVar98;
  long lVar99;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  long lVar100;
  undefined4 uVar101;
  ulong uVar102;
  ulong uVar103;
  byte unaff_R14B;
  float fVar104;
  undefined8 uVar105;
  float fVar132;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 extraout_var [60];
  undefined1 auVar130 [64];
  undefined1 extraout_var_00 [60];
  float fVar137;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar138 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar187;
  float fVar188;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar189;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar221;
  float fVar223;
  undefined1 auVar210 [16];
  float fVar225;
  undefined1 auVar217 [32];
  float fVar222;
  float fVar224;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar233 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [28];
  undefined1 auVar237 [32];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar240 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  float fVar257;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar258;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar261 [32];
  float fVar267;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar274;
  undefined1 in_ZMM10 [64];
  undefined1 auVar273 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  float fVar278;
  undefined1 in_ZMM11 [64];
  undefined1 auVar277 [64];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar279;
  float fVar287;
  undefined1 auVar280 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [64];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_b31;
  int local_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined4 local_9b8;
  float local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  uint local_9a4;
  uint local_9a0;
  ulong local_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [4];
  undefined1 auStack_91c [8];
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  ulong local_780;
  undefined1 auStack_778 [24];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  uint uStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  
  PVar8 = prim[1];
  uVar97 = (ulong)(byte)PVar8;
  lVar99 = uVar97 * 0x25;
  auVar114 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar99 + 6));
  fVar209 = *(float *)(prim + lVar99 + 0x12);
  auVar106._0_4_ = fVar209 * auVar114._0_4_;
  auVar106._4_4_ = fVar209 * auVar114._4_4_;
  auVar106._8_4_ = fVar209 * auVar114._8_4_;
  auVar106._12_4_ = fVar209 * auVar114._12_4_;
  auVar167._0_4_ = fVar209 * (ray->dir).field_0.m128[0];
  auVar167._4_4_ = fVar209 * (ray->dir).field_0.m128[1];
  auVar167._8_4_ = fVar209 * (ray->dir).field_0.m128[2];
  auVar167._12_4_ = fVar209 * (ray->dir).field_0.m128[3];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar125 = vpmovsxbd_avx2(auVar114);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar233 = vpmovsxbd_avx2(auVar288);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar291 = vpmovsxbd_avx2(auVar271);
  auVar291 = vcvtdq2ps_avx(auVar291);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar97 * 0xf + 6);
  auVar14 = vpmovsxbd_avx2(auVar4);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar15 = vpmovsxbd_avx2(auVar141);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar97 + 6);
  auVar123 = vpmovsxbd_avx2(auVar146);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar97 * 0x1a + 6);
  auVar16 = vpmovsxbd_avx2(auVar5);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 * 0x1b + 6);
  auVar154 = vpmovsxbd_avx2(auVar6);
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar97 * 0x1c + 6);
  auVar17 = vpmovsxbd_avx2(auVar7);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar248._4_4_ = auVar167._0_4_;
  auVar248._0_4_ = auVar167._0_4_;
  auVar248._8_4_ = auVar167._0_4_;
  auVar248._12_4_ = auVar167._0_4_;
  auVar248._16_4_ = auVar167._0_4_;
  auVar248._20_4_ = auVar167._0_4_;
  auVar248._24_4_ = auVar167._0_4_;
  auVar248._28_4_ = auVar167._0_4_;
  auVar114 = vmovshdup_avx(auVar167);
  uVar105 = auVar114._0_8_;
  auVar297._8_8_ = uVar105;
  auVar297._0_8_ = uVar105;
  auVar297._16_8_ = uVar105;
  auVar297._24_8_ = uVar105;
  auVar114 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar209 = auVar114._0_4_;
  auVar277._0_4_ = fVar209 * auVar291._0_4_;
  fVar221 = auVar114._4_4_;
  auVar277._4_4_ = fVar221 * auVar291._4_4_;
  auVar277._8_4_ = fVar209 * auVar291._8_4_;
  auVar277._12_4_ = fVar221 * auVar291._12_4_;
  auVar277._16_4_ = fVar209 * auVar291._16_4_;
  auVar277._20_4_ = fVar221 * auVar291._20_4_;
  auVar277._28_36_ = in_ZMM11._28_36_;
  auVar277._24_4_ = fVar209 * auVar291._24_4_;
  auVar273._0_4_ = auVar123._0_4_ * fVar209;
  auVar273._4_4_ = auVar123._4_4_ * fVar221;
  auVar273._8_4_ = auVar123._8_4_ * fVar209;
  auVar273._12_4_ = auVar123._12_4_ * fVar221;
  auVar273._16_4_ = auVar123._16_4_ * fVar209;
  auVar273._20_4_ = auVar123._20_4_ * fVar221;
  auVar273._28_36_ = in_ZMM10._28_36_;
  auVar273._24_4_ = auVar123._24_4_ * fVar209;
  auVar261._0_4_ = auVar17._0_4_ * fVar209;
  auVar261._4_4_ = auVar17._4_4_ * fVar221;
  auVar261._8_4_ = auVar17._8_4_ * fVar209;
  auVar261._12_4_ = auVar17._12_4_ * fVar221;
  auVar261._16_4_ = auVar17._16_4_ * fVar209;
  auVar261._20_4_ = auVar17._20_4_ * fVar221;
  auVar261._24_4_ = auVar17._24_4_ * fVar209;
  auVar261._28_4_ = 0;
  auVar114 = vfmadd231ps_fma(auVar277._0_32_,auVar297,auVar233);
  auVar288 = vfmadd231ps_fma(auVar273._0_32_,auVar297,auVar15);
  auVar271 = vfmadd231ps_fma(auVar261,auVar154,auVar297);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar248,auVar125);
  auVar288 = vfmadd231ps_fma(ZEXT1632(auVar288),auVar248,auVar14);
  auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar16,auVar248);
  auVar249._4_4_ = auVar106._0_4_;
  auVar249._0_4_ = auVar106._0_4_;
  auVar249._8_4_ = auVar106._0_4_;
  auVar249._12_4_ = auVar106._0_4_;
  auVar249._16_4_ = auVar106._0_4_;
  auVar249._20_4_ = auVar106._0_4_;
  auVar249._24_4_ = auVar106._0_4_;
  auVar249._28_4_ = auVar106._0_4_;
  auVar114 = vmovshdup_avx(auVar106);
  uVar105 = auVar114._0_8_;
  auVar298._8_8_ = uVar105;
  auVar298._0_8_ = uVar105;
  auVar298._16_8_ = uVar105;
  auVar298._24_8_ = uVar105;
  auVar114 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar209 = auVar114._0_4_;
  auVar177._0_4_ = fVar209 * auVar291._0_4_;
  fVar221 = auVar114._4_4_;
  auVar177._4_4_ = fVar221 * auVar291._4_4_;
  auVar177._8_4_ = fVar209 * auVar291._8_4_;
  auVar177._12_4_ = fVar221 * auVar291._12_4_;
  auVar177._16_4_ = fVar209 * auVar291._16_4_;
  auVar177._20_4_ = fVar221 * auVar291._20_4_;
  auVar177._24_4_ = fVar209 * auVar291._24_4_;
  auVar177._28_4_ = 0;
  auVar242._4_4_ = auVar123._4_4_ * fVar221;
  auVar242._0_4_ = auVar123._0_4_ * fVar209;
  auVar242._8_4_ = auVar123._8_4_ * fVar209;
  auVar242._12_4_ = auVar123._12_4_ * fVar221;
  auVar242._16_4_ = auVar123._16_4_ * fVar209;
  auVar242._20_4_ = auVar123._20_4_ * fVar221;
  auVar242._24_4_ = auVar123._24_4_ * fVar209;
  auVar242._28_4_ = auVar291._28_4_;
  auVar291._4_4_ = auVar17._4_4_ * fVar221;
  auVar291._0_4_ = auVar17._0_4_ * fVar209;
  auVar291._8_4_ = auVar17._8_4_ * fVar209;
  auVar291._12_4_ = auVar17._12_4_ * fVar221;
  auVar291._16_4_ = auVar17._16_4_ * fVar209;
  auVar291._20_4_ = auVar17._20_4_ * fVar221;
  auVar291._24_4_ = auVar17._24_4_ * fVar209;
  auVar291._28_4_ = fVar221;
  auVar114 = vfmadd231ps_fma(auVar177,auVar298,auVar233);
  auVar141 = vfmadd231ps_fma(auVar242,auVar298,auVar15);
  auVar146 = vfmadd231ps_fma(auVar291,auVar298,auVar154);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar249,auVar125);
  auVar167 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar249,auVar14);
  local_7c0._8_4_ = 0x7fffffff;
  local_7c0._0_8_ = 0x7fffffff7fffffff;
  local_7c0._12_4_ = 0x7fffffff;
  local_7c0._16_4_ = 0x7fffffff;
  local_7c0._20_4_ = 0x7fffffff;
  local_7c0._24_4_ = 0x7fffffff;
  local_7c0._28_4_ = 0x7fffffff;
  auVar280._8_4_ = 0x219392ef;
  auVar280._0_8_ = 0x219392ef219392ef;
  auVar280._12_4_ = 0x219392ef;
  auVar280._16_4_ = 0x219392ef;
  auVar280._20_4_ = 0x219392ef;
  auVar280._24_4_ = 0x219392ef;
  auVar280._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar4),local_7c0);
  auVar125 = vcmpps_avx(auVar125,auVar280,1);
  auVar233 = vblendvps_avx(ZEXT1632(auVar4),auVar280,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar288),local_7c0);
  auVar125 = vcmpps_avx(auVar125,auVar280,1);
  auVar291 = vblendvps_avx(ZEXT1632(auVar288),auVar280,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar271),local_7c0);
  auVar125 = vcmpps_avx(auVar125,auVar280,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar271),auVar280,auVar125);
  auVar123 = vrcpps_avx(auVar233);
  fVar209 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar99 + 0x16)) *
            *(float *)(prim + lVar99 + 0x1a);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar249,auVar16);
  auVar240._4_4_ = fVar209;
  auVar240._0_4_ = fVar209;
  auVar240._8_4_ = fVar209;
  auVar240._12_4_ = fVar209;
  auVar240._16_4_ = fVar209;
  auVar240._20_4_ = fVar209;
  auVar240._24_4_ = fVar209;
  auVar240._28_4_ = fVar209;
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xb + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar4 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xd + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar141 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x12 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar102 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 2 + uVar102 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar146 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar273 = ZEXT1664(auVar146);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x18 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar5 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar277 = ZEXT1664(auVar5);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1d + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 + (ulong)(byte)PVar8 * 0x20 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar6 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar8 * 0x20 - uVar97) + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar286 = ZEXT3264(auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x23 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar299._8_4_ = 0x3f800000;
  auVar299._0_8_ = &DAT_3f8000003f800000;
  auVar299._12_4_ = 0x3f800000;
  auVar299._16_4_ = 0x3f800000;
  auVar299._20_4_ = 0x3f800000;
  auVar299._24_4_ = 0x3f800000;
  auVar299._28_4_ = 0x3f800000;
  auVar7 = vfmadd213ps_fma(auVar15,auVar240,auVar14);
  auVar14 = vrcpps_avx(auVar291);
  auVar114 = vfnmadd213ps_fma(auVar233,auVar123,auVar299);
  auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar123,auVar123);
  auVar288 = vfnmadd213ps_fma(auVar291,auVar14,auVar299);
  auVar288 = vfmadd132ps_fma(ZEXT1632(auVar288),auVar14,auVar14);
  auVar233 = vrcpps_avx(auVar125);
  auVar271 = vfnmadd213ps_fma(auVar125,auVar233,auVar299);
  auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar233,auVar233);
  auVar125 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar106));
  auVar233 = vsubps_avx(ZEXT1632(auVar141),ZEXT1632(auVar106));
  auVar14._4_4_ = auVar114._4_4_ * auVar125._4_4_;
  auVar14._0_4_ = auVar114._0_4_ * auVar125._0_4_;
  auVar14._8_4_ = auVar114._8_4_ * auVar125._8_4_;
  auVar14._12_4_ = auVar114._12_4_ * auVar125._12_4_;
  auVar14._16_4_ = auVar125._16_4_ * 0.0;
  auVar14._20_4_ = auVar125._20_4_ * 0.0;
  auVar14._24_4_ = auVar125._24_4_ * 0.0;
  auVar14._28_4_ = auVar125._28_4_;
  auVar15._4_4_ = auVar114._4_4_ * auVar233._4_4_;
  auVar15._0_4_ = auVar114._0_4_ * auVar233._0_4_;
  auVar15._8_4_ = auVar114._8_4_ * auVar233._8_4_;
  auVar15._12_4_ = auVar114._12_4_ * auVar233._12_4_;
  auVar15._16_4_ = auVar233._16_4_ * 0.0;
  auVar15._20_4_ = auVar233._20_4_ * 0.0;
  auVar15._24_4_ = auVar233._24_4_ * 0.0;
  auVar15._28_4_ = auVar233._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar146),ZEXT1632(auVar167));
  auVar233 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar167));
  auVar123._4_4_ = auVar288._4_4_ * auVar125._4_4_;
  auVar123._0_4_ = auVar288._0_4_ * auVar125._0_4_;
  auVar123._8_4_ = auVar288._8_4_ * auVar125._8_4_;
  auVar123._12_4_ = auVar288._12_4_ * auVar125._12_4_;
  auVar123._16_4_ = auVar125._16_4_ * 0.0;
  auVar123._20_4_ = auVar125._20_4_ * 0.0;
  auVar123._24_4_ = auVar125._24_4_ * 0.0;
  auVar123._28_4_ = auVar125._28_4_;
  auVar16._4_4_ = auVar288._4_4_ * auVar233._4_4_;
  auVar16._0_4_ = auVar288._0_4_ * auVar233._0_4_;
  auVar16._8_4_ = auVar288._8_4_ * auVar233._8_4_;
  auVar16._12_4_ = auVar288._12_4_ * auVar233._12_4_;
  auVar16._16_4_ = auVar233._16_4_ * 0.0;
  auVar16._20_4_ = auVar233._20_4_ * 0.0;
  auVar16._24_4_ = auVar233._24_4_ * 0.0;
  auVar16._28_4_ = auVar233._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar107));
  auVar154._4_4_ = auVar271._4_4_ * auVar125._4_4_;
  auVar154._0_4_ = auVar271._0_4_ * auVar125._0_4_;
  auVar154._8_4_ = auVar271._8_4_ * auVar125._8_4_;
  auVar154._12_4_ = auVar271._12_4_ * auVar125._12_4_;
  auVar154._16_4_ = auVar125._16_4_ * 0.0;
  auVar154._20_4_ = auVar125._20_4_ * 0.0;
  auVar154._24_4_ = auVar125._24_4_ * 0.0;
  auVar154._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar107));
  auVar17._4_4_ = auVar271._4_4_ * auVar125._4_4_;
  auVar17._0_4_ = auVar271._0_4_ * auVar125._0_4_;
  auVar17._8_4_ = auVar271._8_4_ * auVar125._8_4_;
  auVar17._12_4_ = auVar271._12_4_ * auVar125._12_4_;
  auVar17._16_4_ = auVar125._16_4_ * 0.0;
  auVar17._20_4_ = auVar125._20_4_ * 0.0;
  auVar17._24_4_ = auVar125._24_4_ * 0.0;
  auVar17._28_4_ = auVar125._28_4_;
  auVar125 = vpminsd_avx2(auVar14,auVar15);
  auVar233 = vpminsd_avx2(auVar123,auVar16);
  auVar125 = vmaxps_avx(auVar125,auVar233);
  auVar233 = vpminsd_avx2(auVar154,auVar17);
  uVar101 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar250._4_4_ = uVar101;
  auVar250._0_4_ = uVar101;
  auVar250._8_4_ = uVar101;
  auVar250._12_4_ = uVar101;
  auVar250._16_4_ = uVar101;
  auVar250._20_4_ = uVar101;
  auVar250._24_4_ = uVar101;
  auVar250._28_4_ = uVar101;
  auVar233 = vmaxps_avx(auVar233,auVar250);
  auVar125 = vmaxps_avx(auVar125,auVar233);
  local_280._4_4_ = auVar125._4_4_ * 0.99999964;
  local_280._0_4_ = auVar125._0_4_ * 0.99999964;
  local_280._8_4_ = auVar125._8_4_ * 0.99999964;
  local_280._12_4_ = auVar125._12_4_ * 0.99999964;
  local_280._16_4_ = auVar125._16_4_ * 0.99999964;
  local_280._20_4_ = auVar125._20_4_ * 0.99999964;
  local_280._24_4_ = auVar125._24_4_ * 0.99999964;
  local_280._28_4_ = auVar125._28_4_;
  auVar125 = vpmaxsd_avx2(auVar14,auVar15);
  auVar233 = vpmaxsd_avx2(auVar123,auVar16);
  auVar125 = vminps_avx(auVar125,auVar233);
  auVar233 = vpmaxsd_avx2(auVar154,auVar17);
  fVar209 = ray->tfar;
  auVar178._4_4_ = fVar209;
  auVar178._0_4_ = fVar209;
  auVar178._8_4_ = fVar209;
  auVar178._12_4_ = fVar209;
  auVar178._16_4_ = fVar209;
  auVar178._20_4_ = fVar209;
  auVar178._24_4_ = fVar209;
  auVar178._28_4_ = fVar209;
  auVar233 = vminps_avx(auVar233,auVar178);
  auVar125 = vminps_avx(auVar125,auVar233);
  auVar233._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar233._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar233._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar233._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar233._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar233._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar233._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar233._28_4_ = auVar125._28_4_;
  auVar149._1_3_ = 0;
  auVar149[0] = PVar8;
  auVar149[4] = PVar8;
  auVar149._5_3_ = 0;
  auVar149[8] = PVar8;
  auVar149._9_3_ = 0;
  auVar149[0xc] = PVar8;
  auVar149._13_3_ = 0;
  auVar149[0x10] = PVar8;
  auVar149._17_3_ = 0;
  auVar149[0x14] = PVar8;
  auVar149._21_3_ = 0;
  auVar149[0x18] = PVar8;
  auVar149._25_3_ = 0;
  auVar149[0x1c] = PVar8;
  auVar149._29_3_ = 0;
  auVar125 = vcmpps_avx(local_280,auVar233,2);
  auVar233 = vpcmpgtd_avx2(auVar149,_DAT_0205a920);
  auVar125 = vandps_avx(auVar125,auVar233);
  uVar96 = vmovmskps_avx(auVar125);
  local_b31 = uVar96 != 0;
  if (uVar96 == 0) {
    return local_b31;
  }
  uVar96 = uVar96 & 0xff;
  auVar125._16_16_ = mm_lookupmask_ps._240_16_;
  auVar125._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,0x80);
  local_640 = 0x80000000;
  uStack_63c = 0x80000000;
  uStack_638 = 0x80000000;
  uStack_634 = 0x80000000;
  fStack_630 = -0.0;
  fStack_62c = -0.0;
  fStack_628 = -0.0;
  uStack_624 = 0x80000000;
  local_7d0 = prim;
LAB_01950607:
  lVar99 = 0;
  local_7c8 = (ulong)uVar96;
  for (uVar97 = local_7c8; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar99 = lVar99 + 1;
  }
  local_aa8 = (ulong)*(uint *)(local_7d0 + 2);
  local_988 = (ulong)*(uint *)(local_7d0 + lVar99 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_aa8].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_988 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar209 = (pGVar9->time_range).lower;
  fVar209 = pGVar9->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar209) / ((pGVar9->time_range).upper - fVar209));
  auVar114 = vroundss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),9);
  auVar114 = vminss_avx(auVar114,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar114 = vmaxss_avx(ZEXT816(0) << 0x20,auVar114);
  fVar209 = fVar209 - auVar114._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar100 = (long)(int)auVar114._0_4_ * 0x38;
  lVar99 = *(long *)(_Var10 + 0x10 + lVar100);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar100);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar100);
  pfVar1 = (float *)(lVar11 + uVar97 * lVar12);
  auVar138._0_4_ = fVar209 * *pfVar1;
  auVar138._4_4_ = fVar209 * pfVar1[1];
  auVar138._8_4_ = fVar209 * pfVar1[2];
  auVar138._12_4_ = fVar209 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar97 + 1) * lVar12);
  auVar168._0_4_ = fVar209 * *pfVar1;
  auVar168._4_4_ = fVar209 * pfVar1[1];
  auVar168._8_4_ = fVar209 * pfVar1[2];
  auVar168._12_4_ = fVar209 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar97 + 2) * lVar12);
  auVar210._0_4_ = fVar209 * *pfVar1;
  auVar210._4_4_ = fVar209 * pfVar1[1];
  auVar210._8_4_ = fVar209 * pfVar1[2];
  auVar210._12_4_ = fVar209 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar97 + 3));
  auVar190._0_4_ = fVar209 * *pfVar1;
  auVar190._4_4_ = fVar209 * pfVar1[1];
  auVar190._8_4_ = fVar209 * pfVar1[2];
  auVar190._12_4_ = fVar209 * pfVar1[3];
  lVar11 = *(long *)(_Var10 + lVar100);
  fVar209 = 1.0 - fVar209;
  auVar107._4_4_ = fVar209;
  auVar107._0_4_ = fVar209;
  auVar107._8_4_ = fVar209;
  auVar107._12_4_ = fVar209;
  auVar4 = vfmadd231ps_fma(auVar138,auVar107,*(undefined1 (*) [16])(lVar11 + lVar99 * uVar97));
  auVar141 = vfmadd231ps_fma(auVar168,auVar107,
                             *(undefined1 (*) [16])(lVar11 + lVar99 * (uVar97 + 1)));
  auVar146 = vfmadd231ps_fma(auVar210,auVar107,
                             *(undefined1 (*) [16])(lVar11 + lVar99 * (uVar97 + 2)));
  auVar5 = vfmadd231ps_fma(auVar190,auVar107,*(undefined1 (*) [16])(lVar11 + lVar99 * (uVar97 + 3)))
  ;
  auVar226._0_4_ = (auVar4._0_4_ + auVar141._0_4_ + auVar146._0_4_ + auVar5._0_4_) * 0.25;
  auVar226._4_4_ = (auVar4._4_4_ + auVar141._4_4_ + auVar146._4_4_ + auVar5._4_4_) * 0.25;
  auVar226._8_4_ = (auVar4._8_4_ + auVar141._8_4_ + auVar146._8_4_ + auVar5._8_4_) * 0.25;
  auVar226._12_4_ = (auVar4._12_4_ + auVar141._12_4_ + auVar146._12_4_ + auVar5._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar114 = vsubps_avx(auVar226,(undefined1  [16])aVar2);
  auVar114 = vdpps_avx(auVar114,(undefined1  [16])aVar3,0x7f);
  auVar288 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar271 = vrcpss_avx(auVar288,auVar288);
  auVar288 = vfnmadd213ss_fma(auVar271,auVar288,ZEXT416(0x40000000));
  auVar264 = ZEXT1664(auVar288);
  fVar209 = auVar271._0_4_ * auVar288._0_4_;
  auVar244 = ZEXT464((uint)fVar209);
  fVar209 = auVar114._0_4_ * fVar209;
  local_7f0 = ZEXT416((uint)fVar209);
  auVar227._4_4_ = fVar209;
  auVar227._0_4_ = fVar209;
  auVar227._8_4_ = fVar209;
  auVar227._12_4_ = fVar209;
  fStack_a70 = fVar209;
  _local_a80 = auVar227;
  fStack_a6c = fVar209;
  fStack_a68 = fVar209;
  fStack_a64 = fVar209;
  auVar114 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar227);
  auVar114 = vblendps_avx(auVar114,_DAT_01feba10,8);
  local_a20 = vsubps_avx(auVar4,auVar114);
  local_a30 = vsubps_avx(auVar146,auVar114);
  auVar220 = ZEXT1664(local_a30);
  local_a40 = vsubps_avx(auVar141,auVar114);
  _local_a50 = vsubps_avx(auVar5,auVar114);
  auVar114 = vmovshdup_avx(local_a20);
  local_1a0 = auVar114._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar114 = vshufps_avx(local_a20,local_a20,0xaa);
  local_1c0 = auVar114._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar114 = vshufps_avx(local_a20,local_a20,0xff);
  local_1e0 = auVar114._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar114 = vmovshdup_avx(local_a40);
  local_340 = auVar114._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar114 = vshufps_avx(local_a40,local_a40,0xaa);
  local_360 = auVar114._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar114 = vshufps_avx(local_a40,local_a40,0xff);
  local_200 = auVar114._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar114 = vmovshdup_avx(local_a30);
  local_220 = auVar114._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar114 = vshufps_avx(local_a30,local_a30,0xaa);
  local_380 = auVar114._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar114 = vshufps_avx(local_a30,local_a30,0xff);
  local_3a0 = auVar114._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar114 = vmovshdup_avx(_local_a50);
  local_3c0 = auVar114._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar114 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_3e0 = auVar114._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar114 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_400 = auVar114._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar108._0_4_ = aVar3.x * aVar3.x;
  auVar108._4_4_ = aVar3.y * aVar3.y;
  auVar108._8_4_ = aVar3.z * aVar3.z;
  auVar108._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar114 = vshufps_avx(auVar108,auVar108,0xaa);
  uVar101 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_580._4_4_ = uVar101;
  local_580._0_4_ = uVar101;
  fStack_578 = (float)uVar101;
  fStack_574 = (float)uVar101;
  fStack_570 = (float)uVar101;
  fStack_56c = (float)uVar101;
  fStack_568 = (float)uVar101;
  register0x0000125c = uVar101;
  uVar105 = auVar114._0_8_;
  auVar232._8_8_ = uVar105;
  auVar232._0_8_ = uVar105;
  auVar232._16_8_ = uVar105;
  auVar232._24_8_ = uVar105;
  auVar114 = vfmadd231ps_fma(auVar232,_local_580,_local_580);
  uVar101 = *(undefined4 *)&(ray->dir).field_0;
  local_600._4_4_ = uVar101;
  local_600._0_4_ = uVar101;
  fStack_5f8 = (float)uVar101;
  fStack_5f4 = (float)uVar101;
  fStack_5f0 = (float)uVar101;
  fStack_5ec = (float)uVar101;
  fStack_5e8 = (float)uVar101;
  register0x0000121c = uVar101;
  auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),_local_600,_local_600);
  auVar235 = ZEXT1664(auVar114);
  uVar102 = 1;
  uVar97 = 0;
  bVar98 = 0;
  local_620 = (ray->dir).field_0.m128[2];
  local_420 = local_a20._0_4_;
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  local_260 = local_a40._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_440 = local_a30._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_460 = local_a50._0_4_;
  local_4a0 = vandps_avx(ZEXT1632(auVar114),local_7c0);
  local_7e0 = ZEXT816(0x3f80000000000000);
  local_240 = ZEXT1632(auVar114);
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  do {
    auVar150._8_4_ = 0x3f800000;
    auVar150._0_8_ = &DAT_3f8000003f800000;
    auVar150._12_4_ = 0x3f800000;
    auVar150._16_4_ = 0x3f800000;
    auVar150._20_4_ = 0x3f800000;
    auVar150._24_4_ = 0x3f800000;
    auVar150._28_4_ = 0x3f800000;
    auVar114 = vmovshdup_avx(local_7e0);
    fVar209 = local_7e0._0_4_;
    fVar287 = auVar114._0_4_ - fVar209;
    fVar224 = fVar287 * 0.04761905;
    local_980._4_4_ = fVar209;
    local_980._0_4_ = fVar209;
    local_980._8_4_ = fVar209;
    local_980._12_4_ = fVar209;
    local_980._16_4_ = fVar209;
    local_980._20_4_ = fVar209;
    local_980._24_4_ = fVar209;
    local_980._28_4_ = fVar209;
    local_6c0._4_4_ = fVar287;
    local_6c0._0_4_ = fVar287;
    local_6c0._8_4_ = fVar287;
    local_6c0._12_4_ = fVar287;
    local_6c0._16_4_ = fVar287;
    local_6c0._20_4_ = fVar287;
    local_6c0._24_4_ = fVar287;
    local_6c0._28_4_ = fVar287;
    auVar114 = vfmadd231ps_fma(local_980,local_6c0,_DAT_02020f20);
    auVar125 = vsubps_avx(auVar150,ZEXT1632(auVar114));
    fVar209 = auVar125._0_4_;
    fVar223 = auVar125._4_4_;
    fVar245 = auVar125._8_4_;
    fVar246 = auVar125._12_4_;
    fVar247 = auVar125._16_4_;
    fVar137 = auVar125._20_4_;
    fVar279 = auVar125._24_4_;
    fVar104 = fVar209 * fVar209 * fVar209;
    fVar131 = fVar223 * fVar223 * fVar223;
    fVar132 = fVar245 * fVar245 * fVar245;
    fVar133 = fVar246 * fVar246 * fVar246;
    fVar134 = fVar247 * fVar247 * fVar247;
    fVar135 = fVar137 * fVar137 * fVar137;
    fVar136 = fVar279 * fVar279 * fVar279;
    fVar221 = auVar114._0_4_;
    fVar225 = auVar114._4_4_;
    fVar257 = auVar114._8_4_;
    fVar222 = auVar114._12_4_;
    fVar166 = fVar221 * fVar221 * fVar221;
    fVar187 = fVar225 * fVar225 * fVar225;
    fVar188 = fVar257 * fVar257 * fVar257;
    fVar189 = fVar222 * fVar222 * fVar222;
    fVar258 = fVar209 * fVar221;
    fVar265 = fVar223 * fVar225;
    fVar266 = fVar245 * fVar257;
    fVar267 = fVar246 * fVar222;
    fVar268 = fVar247 * 0.0;
    fVar269 = fVar137 * 0.0;
    fVar270 = fVar279 * 0.0;
    fVar274 = auVar273._28_4_ + auVar286._28_4_ + fVar287;
    fVar278 = auVar277._28_4_;
    auVar20._4_4_ = fVar131 * 0.16666667;
    auVar20._0_4_ = fVar104 * 0.16666667;
    auVar20._8_4_ = fVar132 * 0.16666667;
    auVar20._12_4_ = fVar133 * 0.16666667;
    auVar20._16_4_ = fVar134 * 0.16666667;
    auVar20._20_4_ = fVar135 * 0.16666667;
    auVar20._24_4_ = fVar136 * 0.16666667;
    auVar20._28_4_ = fVar274;
    auVar21._4_4_ =
         (fVar223 * fVar265 * 12.0 + fVar265 * fVar225 * 6.0 + fVar187 + fVar131 * 4.0) * 0.16666667
    ;
    auVar21._0_4_ =
         (fVar209 * fVar258 * 12.0 + fVar258 * fVar221 * 6.0 + fVar166 + fVar104 * 4.0) * 0.16666667
    ;
    auVar21._8_4_ =
         (fVar245 * fVar266 * 12.0 + fVar266 * fVar257 * 6.0 + fVar188 + fVar132 * 4.0) * 0.16666667
    ;
    auVar21._12_4_ =
         (fVar246 * fVar267 * 12.0 + fVar267 * fVar222 * 6.0 + fVar189 + fVar133 * 4.0) * 0.16666667
    ;
    auVar21._16_4_ =
         (fVar247 * fVar268 * 12.0 + fVar268 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar21._20_4_ =
         (fVar137 * fVar269 * 12.0 + fVar269 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar21._24_4_ =
         (fVar279 * fVar270 * 12.0 + fVar270 * 0.0 * 6.0 + fVar136 * 4.0 + 0.0) * 0.16666667;
    auVar21._28_4_ = fVar278;
    auVar22._4_4_ =
         (fVar187 * 4.0 + fVar131 + fVar265 * fVar225 * 12.0 + fVar223 * fVar265 * 6.0) * 0.16666667
    ;
    auVar22._0_4_ =
         (fVar166 * 4.0 + fVar104 + fVar258 * fVar221 * 12.0 + fVar209 * fVar258 * 6.0) * 0.16666667
    ;
    auVar22._8_4_ =
         (fVar188 * 4.0 + fVar132 + fVar266 * fVar257 * 12.0 + fVar245 * fVar266 * 6.0) * 0.16666667
    ;
    auVar22._12_4_ =
         (fVar189 * 4.0 + fVar133 + fVar267 * fVar222 * 12.0 + fVar246 * fVar267 * 6.0) * 0.16666667
    ;
    auVar22._16_4_ = (fVar134 + 0.0 + fVar268 * 0.0 * 12.0 + fVar247 * fVar268 * 6.0) * 0.16666667;
    auVar22._20_4_ = (fVar135 + 0.0 + fVar269 * 0.0 * 12.0 + fVar137 * fVar269 * 6.0) * 0.16666667;
    auVar22._24_4_ = (fVar136 + 0.0 + fVar270 * 0.0 * 12.0 + fVar279 * fVar270 * 6.0) * 0.16666667;
    auVar22._28_4_ = auVar286._28_4_;
    fVar166 = fVar166 * 0.16666667;
    fVar187 = fVar187 * 0.16666667;
    fVar188 = fVar188 * 0.16666667;
    fVar189 = fVar189 * 0.16666667;
    auVar23._4_4_ = fStack_45c * fVar187;
    auVar23._0_4_ = local_460 * fVar166;
    auVar23._8_4_ = fStack_458 * fVar188;
    auVar23._12_4_ = fStack_454 * fVar189;
    auVar23._16_4_ = fStack_450 * 0.0;
    auVar23._20_4_ = fStack_44c * 0.0;
    auVar23._24_4_ = fStack_448 * 0.0;
    auVar23._28_4_ = fVar287;
    auVar24._4_4_ = fVar187 * local_3c0._4_4_;
    auVar24._0_4_ = fVar166 * (float)local_3c0;
    auVar24._8_4_ = fVar188 * (float)uStack_3b8;
    auVar24._12_4_ = fVar189 * uStack_3b8._4_4_;
    auVar24._16_4_ = (float)uStack_3b0 * 0.0;
    auVar24._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar24._24_4_ = (float)uStack_3a8 * 0.0;
    auVar24._28_4_ = 0;
    auVar25._4_4_ = fVar187 * local_3e0._4_4_;
    auVar25._0_4_ = fVar166 * (float)local_3e0;
    auVar25._8_4_ = fVar188 * (float)uStack_3d8;
    auVar25._12_4_ = fVar189 * uStack_3d8._4_4_;
    auVar25._16_4_ = (float)uStack_3d0 * 0.0;
    auVar25._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_3c8 * 0.0;
    auVar25._28_4_ = 0x3e2aaaab;
    auVar26._4_4_ = fVar187 * local_400._4_4_;
    auVar26._0_4_ = fVar166 * (float)local_400;
    auVar26._8_4_ = fVar188 * (float)uStack_3f8;
    auVar26._12_4_ = fVar189 * uStack_3f8._4_4_;
    auVar26._16_4_ = (float)uStack_3f0 * 0.0;
    auVar26._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_3e8 * 0.0;
    auVar26._28_4_ = fVar274 + fVar278 + auVar235._28_4_;
    auVar78._4_4_ = uStack_43c;
    auVar78._0_4_ = local_440;
    auVar78._8_4_ = uStack_438;
    auVar78._12_4_ = uStack_434;
    auVar78._16_4_ = uStack_430;
    auVar78._20_4_ = uStack_42c;
    auVar78._24_4_ = uStack_428;
    auVar78._28_4_ = uStack_424;
    auVar114 = vfmadd231ps_fma(auVar23,auVar22,auVar78);
    auVar91._8_8_ = uStack_218;
    auVar91._0_8_ = local_220;
    auVar91._16_8_ = uStack_210;
    auVar91._24_8_ = uStack_208;
    auVar288 = vfmadd231ps_fma(auVar24,auVar22,auVar91);
    auVar84._8_8_ = uStack_378;
    auVar84._0_8_ = local_380;
    auVar84._16_8_ = uStack_370;
    auVar84._24_8_ = uStack_368;
    auVar271 = vfmadd231ps_fma(auVar25,auVar22,auVar84);
    auVar82._8_8_ = uStack_398;
    auVar82._0_8_ = local_3a0;
    auVar82._16_8_ = uStack_390;
    auVar82._24_8_ = uStack_388;
    auVar4 = vfmadd231ps_fma(auVar26,auVar22,auVar82);
    auVar90._4_4_ = uStack_25c;
    auVar90._0_4_ = local_260;
    auVar90._8_4_ = uStack_258;
    auVar90._12_4_ = uStack_254;
    auVar90._16_4_ = uStack_250;
    auVar90._20_4_ = uStack_24c;
    auVar90._24_4_ = uStack_248;
    auVar90._28_4_ = uStack_244;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar21,auVar90);
    auVar88._8_8_ = uStack_338;
    auVar88._0_8_ = local_340;
    auVar88._16_8_ = uStack_330;
    auVar88._24_8_ = uStack_328;
    auVar288 = vfmadd231ps_fma(ZEXT1632(auVar288),auVar21,auVar88);
    auVar86._8_8_ = uStack_358;
    auVar86._0_8_ = local_360;
    auVar86._16_8_ = uStack_350;
    auVar86._24_8_ = uStack_348;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar21,auVar86);
    auVar92._8_8_ = uStack_1f8;
    auVar92._0_8_ = local_200;
    auVar92._16_8_ = uStack_1f0;
    auVar92._24_8_ = uStack_1e8;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar92,auVar21);
    auVar80._4_4_ = uStack_41c;
    auVar80._0_4_ = local_420;
    auVar80._8_4_ = uStack_418;
    auVar80._12_4_ = uStack_414;
    auVar80._16_4_ = uStack_410;
    auVar80._20_4_ = uStack_40c;
    auVar80._24_4_ = uStack_408;
    auVar80._28_4_ = uStack_404;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar20,auVar80);
    local_ae0 = ZEXT1632(auVar114);
    auVar95._8_8_ = uStack_198;
    auVar95._0_8_ = local_1a0;
    auVar95._16_8_ = uStack_190;
    auVar95._24_8_ = uStack_188;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar288),auVar20,auVar95);
    local_b00 = ZEXT1632(auVar114);
    auVar94._8_8_ = uStack_1b8;
    auVar94._0_8_ = local_1c0;
    auVar94._16_8_ = uStack_1b0;
    auVar94._24_8_ = uStack_1a8;
    auVar288 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar20,auVar94);
    auVar93._8_8_ = uStack_1d8;
    auVar93._0_8_ = local_1e0;
    auVar93._16_8_ = uStack_1d0;
    auVar93._24_8_ = uStack_1c8;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar93,auVar20);
    auVar237._0_4_ = (float)((uint)fVar221 ^ local_640) * fVar221;
    auVar237._4_4_ = (float)((uint)fVar225 ^ uStack_63c) * fVar225;
    auVar237._8_4_ = (float)((uint)fVar257 ^ uStack_638) * fVar257;
    auVar237._12_4_ = (float)((uint)fVar222 ^ uStack_634) * fVar222;
    auVar237._16_4_ = fStack_630 * 0.0;
    auVar237._20_4_ = fStack_62c * 0.0;
    auVar237._24_4_ = fStack_628 * 0.0;
    auVar237._28_4_ = 0;
    auVar27._4_4_ = fVar265 * 4.0;
    auVar27._0_4_ = fVar258 * 4.0;
    auVar27._8_4_ = fVar266 * 4.0;
    auVar27._12_4_ = fVar267 * 4.0;
    auVar27._16_4_ = fVar268 * 4.0;
    auVar27._20_4_ = fVar269 * 4.0;
    fVar287 = auVar264._28_4_;
    auVar27._24_4_ = fVar270 * 4.0;
    auVar27._28_4_ = fVar287;
    auVar233 = vsubps_avx(auVar237,auVar27);
    auVar28._4_4_ = fVar223 * (float)((uint)fVar223 ^ uStack_63c) * 0.5;
    auVar28._0_4_ = fVar209 * (float)((uint)fVar209 ^ local_640) * 0.5;
    auVar28._8_4_ = fVar245 * (float)((uint)fVar245 ^ uStack_638) * 0.5;
    auVar28._12_4_ = fVar246 * (float)((uint)fVar246 ^ uStack_634) * 0.5;
    auVar28._16_4_ = fVar247 * (float)((uint)fVar247 ^ (uint)fStack_630) * 0.5;
    auVar28._20_4_ = fVar137 * (float)((uint)fVar137 ^ (uint)fStack_62c) * 0.5;
    auVar28._24_4_ = fVar279 * (float)((uint)fVar279 ^ (uint)fStack_628) * 0.5;
    auVar28._28_4_ = auVar125._28_4_;
    auVar29._4_4_ = auVar233._4_4_ * 0.5;
    auVar29._0_4_ = auVar233._0_4_ * 0.5;
    auVar29._8_4_ = auVar233._8_4_ * 0.5;
    auVar29._12_4_ = auVar233._12_4_ * 0.5;
    auVar29._16_4_ = auVar233._16_4_ * 0.5;
    auVar29._20_4_ = auVar233._20_4_ * 0.5;
    auVar29._24_4_ = auVar233._24_4_ * 0.5;
    auVar29._28_4_ = auVar233._28_4_;
    auVar30._4_4_ = (fVar265 * 4.0 + fVar223 * fVar223) * 0.5;
    auVar30._0_4_ = (fVar258 * 4.0 + fVar209 * fVar209) * 0.5;
    auVar30._8_4_ = (fVar266 * 4.0 + fVar245 * fVar245) * 0.5;
    auVar30._12_4_ = (fVar267 * 4.0 + fVar246 * fVar246) * 0.5;
    auVar30._16_4_ = (fVar268 * 4.0 + fVar247 * fVar247) * 0.5;
    auVar30._20_4_ = (fVar269 * 4.0 + fVar137 * fVar137) * 0.5;
    auVar30._24_4_ = (fVar270 * 4.0 + fVar279 * fVar279) * 0.5;
    auVar30._28_4_ = fVar287 + auVar244._28_4_;
    fVar209 = fVar221 * fVar221 * 0.5;
    fVar221 = fVar225 * fVar225 * 0.5;
    fVar223 = fVar257 * fVar257 * 0.5;
    fVar225 = fVar222 * fVar222 * 0.5;
    auVar31._4_4_ = fVar221 * fStack_45c;
    auVar31._0_4_ = fVar209 * local_460;
    auVar31._8_4_ = fVar223 * fStack_458;
    auVar31._12_4_ = fVar225 * fStack_454;
    auVar31._16_4_ = fStack_450 * 0.0;
    auVar31._20_4_ = fStack_44c * 0.0;
    auVar31._24_4_ = fStack_448 * 0.0;
    auVar31._28_4_ = fVar287;
    auVar32._4_4_ = fVar221 * local_3c0._4_4_;
    auVar32._0_4_ = fVar209 * (float)local_3c0;
    auVar32._8_4_ = fVar223 * (float)uStack_3b8;
    auVar32._12_4_ = fVar225 * uStack_3b8._4_4_;
    auVar32._16_4_ = (float)uStack_3b0 * 0.0;
    auVar32._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar32._24_4_ = (float)uStack_3a8 * 0.0;
    auVar32._28_4_ = uStack_624;
    auVar33._4_4_ = fVar221 * local_3e0._4_4_;
    auVar33._0_4_ = fVar209 * (float)local_3e0;
    auVar33._8_4_ = fVar223 * (float)uStack_3d8;
    auVar33._12_4_ = fVar225 * uStack_3d8._4_4_;
    auVar33._16_4_ = (float)uStack_3d0 * 0.0;
    auVar33._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar33._24_4_ = (float)uStack_3c8 * 0.0;
    auVar33._28_4_ = fVar278;
    auVar34._4_4_ = fVar221 * local_400._4_4_;
    auVar34._0_4_ = fVar209 * (float)local_400;
    auVar34._8_4_ = fVar223 * (float)uStack_3f8;
    auVar34._12_4_ = fVar225 * uStack_3f8._4_4_;
    auVar34._16_4_ = (float)uStack_3f0 * 0.0;
    auVar34._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar34._24_4_ = (float)uStack_3e8 * 0.0;
    auVar34._28_4_ = auVar220._28_4_;
    auVar79._4_4_ = uStack_43c;
    auVar79._0_4_ = local_440;
    auVar79._8_4_ = uStack_438;
    auVar79._12_4_ = uStack_434;
    auVar79._16_4_ = uStack_430;
    auVar79._20_4_ = uStack_42c;
    auVar79._24_4_ = uStack_428;
    auVar79._28_4_ = uStack_424;
    auVar114 = vfmadd231ps_fma(auVar31,auVar30,auVar79);
    auVar4 = vfmadd231ps_fma(auVar32,auVar30,auVar91);
    auVar85._8_8_ = uStack_378;
    auVar85._0_8_ = local_380;
    auVar85._16_8_ = uStack_370;
    auVar85._24_8_ = uStack_368;
    auVar141 = vfmadd231ps_fma(auVar33,auVar30,auVar85);
    auVar83._8_8_ = uStack_398;
    auVar83._0_8_ = local_3a0;
    auVar83._16_8_ = uStack_390;
    auVar83._24_8_ = uStack_388;
    auVar146 = vfmadd231ps_fma(auVar34,auVar30,auVar83);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar29,auVar90);
    auVar89._8_8_ = uStack_338;
    auVar89._0_8_ = local_340;
    auVar89._16_8_ = uStack_330;
    auVar89._24_8_ = uStack_328;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar29,auVar89);
    auVar87._8_8_ = uStack_358;
    auVar87._0_8_ = local_360;
    auVar87._16_8_ = uStack_350;
    auVar87._24_8_ = uStack_348;
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar29,auVar87);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar92,auVar29);
    auVar81._4_4_ = uStack_41c;
    auVar81._0_4_ = local_420;
    auVar81._8_4_ = uStack_418;
    auVar81._12_4_ = uStack_414;
    auVar81._16_4_ = uStack_410;
    auVar81._20_4_ = uStack_40c;
    auVar81._24_4_ = uStack_408;
    auVar81._28_4_ = uStack_404;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar28,auVar81);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar28,auVar95);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar28,auVar94);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar93,auVar28);
    auVar262._0_4_ = auVar114._0_4_ * fVar224;
    auVar262._4_4_ = auVar114._4_4_ * fVar224;
    auVar262._8_4_ = auVar114._8_4_ * fVar224;
    auVar262._12_4_ = auVar114._12_4_ * fVar224;
    auVar262._16_4_ = fVar224 * 0.0;
    auVar262._20_4_ = fVar224 * 0.0;
    auVar262._24_4_ = fVar224 * 0.0;
    auVar262._28_4_ = 0;
    fVar209 = auVar4._0_4_ * fVar224;
    fVar221 = auVar4._4_4_ * fVar224;
    local_940._4_4_ = fVar221;
    local_940._0_4_ = fVar209;
    fVar223 = auVar4._8_4_ * fVar224;
    fStack_938 = fVar223;
    fVar225 = auVar4._12_4_ * fVar224;
    fStack_934 = fVar225;
    unique0x10005ae0 = fVar224 * 0.0;
    unique0x10005ae4 = fVar224 * 0.0;
    unique0x10005ae8 = fVar224 * 0.0;
    unique0x10005aec = (int)((ulong)uStack_1a8 >> 0x20);
    fVar268 = auVar141._0_4_ * fVar224;
    fVar269 = auVar141._4_4_ * fVar224;
    local_840._4_4_ = fVar269;
    local_840._0_4_ = fVar268;
    fVar270 = auVar141._8_4_ * fVar224;
    local_840._8_4_ = fVar270;
    fVar274 = auVar141._12_4_ * fVar224;
    local_840._12_4_ = fVar274;
    fVar294 = fVar224 * 0.0;
    local_840._16_4_ = fVar294;
    fVar295 = fVar224 * 0.0;
    local_840._20_4_ = fVar295;
    fVar296 = fVar224 * 0.0;
    local_840._24_4_ = fVar296;
    local_840._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar217._0_4_ = fVar224 * auVar146._0_4_;
    auVar217._4_4_ = fVar224 * auVar146._4_4_;
    auVar217._8_4_ = fVar224 * auVar146._8_4_;
    auVar217._12_4_ = fVar224 * auVar146._12_4_;
    auVar217._16_4_ = fVar224 * 0.0;
    auVar217._20_4_ = fVar224 * 0.0;
    auVar217._24_4_ = fVar224 * 0.0;
    auVar217._28_4_ = 0;
    auVar149 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    local_900 = vpermps_avx2(_DAT_0205d4a0,local_b00);
    local_820 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar288));
    auVar15 = vsubps_avx(auVar149,local_ae0);
    auVar123 = vsubps_avx(local_820,ZEXT1632(auVar288));
    fVar279 = auVar123._0_4_;
    fVar104 = auVar123._4_4_;
    auVar35._4_4_ = fVar104 * auVar262._4_4_;
    auVar35._0_4_ = fVar279 * auVar262._0_4_;
    fVar131 = auVar123._8_4_;
    auVar35._8_4_ = fVar131 * auVar262._8_4_;
    fVar133 = auVar123._12_4_;
    auVar35._12_4_ = fVar133 * auVar262._12_4_;
    fVar135 = auVar123._16_4_;
    auVar35._16_4_ = fVar135 * auVar262._16_4_;
    fVar166 = auVar123._20_4_;
    auVar35._20_4_ = fVar166 * auVar262._20_4_;
    fVar187 = auVar123._24_4_;
    auVar35._24_4_ = fVar187 * auVar262._24_4_;
    auVar35._28_4_ = auVar149._28_4_;
    auVar114 = vfmsub231ps_fma(auVar35,local_840,auVar15);
    auVar16 = vsubps_avx(local_900,local_b00);
    fVar267 = auVar15._0_4_;
    fVar302 = auVar15._4_4_;
    auVar36._4_4_ = fVar302 * fVar221;
    auVar36._0_4_ = fVar267 * fVar209;
    fVar303 = auVar15._8_4_;
    auVar36._8_4_ = fVar303 * fVar223;
    fVar304 = auVar15._12_4_;
    auVar36._12_4_ = fVar304 * fVar225;
    fVar305 = auVar15._16_4_;
    auVar36._16_4_ = fVar305 * fVar224 * 0.0;
    fVar306 = auVar15._20_4_;
    auVar36._20_4_ = fVar306 * fVar224 * 0.0;
    fVar307 = auVar15._24_4_;
    auVar36._24_4_ = fVar307 * fVar224 * 0.0;
    auVar36._28_4_ = local_900._28_4_;
    auVar4 = vfmsub231ps_fma(auVar36,auVar262,auVar16);
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar114),ZEXT1632(auVar114));
    fVar224 = auVar16._0_4_;
    fVar278 = auVar16._4_4_;
    auVar37._4_4_ = fVar278 * fVar269;
    auVar37._0_4_ = fVar224 * fVar268;
    fVar188 = auVar16._8_4_;
    auVar37._8_4_ = fVar188 * fVar270;
    fVar189 = auVar16._12_4_;
    auVar37._12_4_ = fVar189 * fVar274;
    fVar258 = auVar16._16_4_;
    auVar37._16_4_ = fVar258 * fVar294;
    fVar265 = auVar16._20_4_;
    auVar37._20_4_ = fVar265 * fVar295;
    fVar266 = auVar16._24_4_;
    auVar37._24_4_ = fVar266 * fVar296;
    auVar37._28_4_ = local_820._28_4_;
    auVar141 = vfmsub231ps_fma(auVar37,_local_940,auVar123);
    auVar204._0_4_ = fVar279 * fVar279;
    auVar204._4_4_ = fVar104 * fVar104;
    auVar204._8_4_ = fVar131 * fVar131;
    auVar204._12_4_ = fVar133 * fVar133;
    auVar204._16_4_ = fVar135 * fVar135;
    auVar204._20_4_ = fVar166 * fVar166;
    auVar204._24_4_ = fVar187 * fVar187;
    auVar204._28_4_ = 0;
    auVar4 = vfmadd231ps_fma(auVar204,auVar16,auVar16);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar15,auVar15);
    auVar125 = vrcpps_avx(ZEXT1632(auVar4));
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT1632(auVar141),ZEXT1632(auVar141));
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = &DAT_3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar114 = vfnmadd213ps_fma(auVar125,ZEXT1632(auVar4),auVar179);
    auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar125,auVar125);
    local_860 = vpermps_avx2(_DAT_0205d4a0,auVar262);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,local_840);
    auVar38._4_4_ = fVar104 * local_860._4_4_;
    auVar38._0_4_ = fVar279 * local_860._0_4_;
    auVar38._8_4_ = fVar131 * local_860._8_4_;
    auVar38._12_4_ = fVar133 * local_860._12_4_;
    auVar38._16_4_ = fVar135 * local_860._16_4_;
    auVar38._20_4_ = fVar166 * local_860._20_4_;
    auVar38._24_4_ = fVar187 * local_860._24_4_;
    auVar38._28_4_ = auVar125._28_4_;
    auVar146 = vfmsub231ps_fma(auVar38,local_aa0,auVar15);
    local_960 = vpermps_avx2(_DAT_0205d4a0,_local_940);
    auVar39._4_4_ = fVar302 * local_960._4_4_;
    auVar39._0_4_ = fVar267 * local_960._0_4_;
    auVar39._8_4_ = fVar303 * local_960._8_4_;
    auVar39._12_4_ = fVar304 * local_960._12_4_;
    auVar39._16_4_ = fVar305 * local_960._16_4_;
    auVar39._20_4_ = fVar306 * local_960._20_4_;
    auVar39._24_4_ = fVar307 * local_960._24_4_;
    auVar39._28_4_ = 0;
    auVar5 = vfmsub231ps_fma(auVar39,local_860,auVar16);
    auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * auVar5._12_4_,
                                                  CONCAT48(auVar5._8_4_ * auVar5._8_4_,
                                                           CONCAT44(auVar5._4_4_ * auVar5._4_4_,
                                                                    auVar5._0_4_ * auVar5._0_4_)))),
                               ZEXT1632(auVar146),ZEXT1632(auVar146));
    fVar221 = local_aa0._0_4_;
    auVar251._0_4_ = fVar224 * fVar221;
    fVar245 = local_aa0._4_4_;
    auVar251._4_4_ = fVar278 * fVar245;
    fVar247 = local_aa0._8_4_;
    auVar251._8_4_ = fVar188 * fVar247;
    fVar287 = local_aa0._12_4_;
    auVar251._12_4_ = fVar189 * fVar287;
    fVar132 = local_aa0._16_4_;
    auVar251._16_4_ = fVar258 * fVar132;
    fVar134 = local_aa0._20_4_;
    auVar251._20_4_ = fVar265 * fVar134;
    fVar136 = local_aa0._24_4_;
    auVar251._24_4_ = fVar266 * fVar136;
    auVar251._28_4_ = 0;
    auVar5 = vfmsub231ps_fma(auVar251,local_960,auVar123);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar125 = vmaxps_avx(ZEXT1632(CONCAT412(auVar141._12_4_ * auVar114._12_4_,
                                             CONCAT48(auVar141._8_4_ * auVar114._8_4_,
                                                      CONCAT44(auVar141._4_4_ * auVar114._4_4_,
                                                               auVar141._0_4_ * auVar114._0_4_)))),
                          ZEXT1632(CONCAT412(auVar146._12_4_ * auVar114._12_4_,
                                             CONCAT48(auVar146._8_4_ * auVar114._8_4_,
                                                      CONCAT44(auVar146._4_4_ * auVar114._4_4_,
                                                               auVar146._0_4_ * auVar114._0_4_)))));
    auVar236._0_4_ = auVar217._0_4_ + auVar271._0_4_;
    auVar236._4_4_ = auVar217._4_4_ + auVar271._4_4_;
    auVar236._8_4_ = auVar217._8_4_ + auVar271._8_4_;
    auVar236._12_4_ = auVar217._12_4_ + auVar271._12_4_;
    auVar236._16_4_ = auVar217._16_4_ + 0.0;
    auVar236._20_4_ = auVar217._20_4_ + 0.0;
    auVar236._24_4_ = auVar217._24_4_ + 0.0;
    auVar238._28_4_ = 0;
    auVar238._0_28_ = auVar236;
    auVar239._12_4_ = 0;
    auVar239._0_12_ = auVar236._16_12_;
    auVar233 = vsubps_avx(ZEXT1632(auVar271),auVar217);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,auVar233);
    auVar177 = ZEXT1632(auVar271);
    _local_8c0 = vpermps_avx2(_DAT_0205d4a0,auVar177);
    auVar233 = vmaxps_avx(auVar177,auVar238);
    auVar291 = vmaxps_avx(local_8a0,_local_8c0);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar4));
    auVar233 = vmaxps_avx(auVar233,auVar291);
    fVar209 = auVar14._0_4_;
    fVar223 = auVar14._4_4_;
    fVar225 = auVar14._8_4_;
    fVar257 = auVar14._12_4_;
    fVar246 = auVar14._16_4_;
    fVar222 = auVar14._20_4_;
    fVar137 = auVar14._24_4_;
    auVar263._0_4_ = fVar209 * fVar209 * fVar209 * auVar4._0_4_ * -0.5;
    auVar263._4_4_ = fVar223 * fVar223 * fVar223 * auVar4._4_4_ * -0.5;
    auVar263._8_4_ = fVar225 * fVar225 * fVar225 * auVar4._8_4_ * -0.5;
    auVar263._12_4_ = fVar257 * fVar257 * fVar257 * auVar4._12_4_ * -0.5;
    auVar263._16_4_ = fVar246 * fVar246 * fVar246 * -0.0;
    auVar263._20_4_ = fVar222 * fVar222 * fVar222 * -0.0;
    auVar263._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
    auVar263._28_4_ = 0;
    auVar118._8_4_ = 0x3fc00000;
    auVar118._0_8_ = 0x3fc000003fc00000;
    auVar118._12_4_ = 0x3fc00000;
    auVar118._16_4_ = 0x3fc00000;
    auVar118._20_4_ = 0x3fc00000;
    auVar118._24_4_ = 0x3fc00000;
    auVar118._28_4_ = 0x3fc00000;
    auVar114 = vfmadd231ps_fma(auVar263,auVar118,auVar14);
    auVar264 = ZEXT1664(auVar114);
    fVar223 = auVar114._0_4_;
    fVar257 = auVar114._4_4_;
    auVar40._4_4_ = fVar278 * fVar257;
    auVar40._0_4_ = fVar224 * fVar223;
    fVar137 = auVar114._8_4_;
    auVar40._8_4_ = fVar188 * fVar137;
    fVar278 = auVar114._12_4_;
    auVar40._12_4_ = fVar189 * fVar278;
    auVar40._16_4_ = fVar258 * 0.0;
    auVar40._20_4_ = fVar265 * 0.0;
    auVar40._24_4_ = fVar266 * 0.0;
    auVar40._28_4_ = 0;
    auVar41._4_4_ = fVar104 * fVar257 * fStack_61c;
    auVar41._0_4_ = fVar279 * fVar223 * local_620;
    auVar41._8_4_ = fVar131 * fVar137 * fStack_618;
    auVar41._12_4_ = fVar133 * fVar278 * fStack_614;
    auVar41._16_4_ = fVar135 * 0.0 * fStack_610;
    auVar41._20_4_ = fVar166 * 0.0 * fStack_60c;
    auVar41._24_4_ = fVar187 * 0.0 * fStack_608;
    auVar41._28_4_ = auVar123._28_4_;
    auVar114 = vfmadd231ps_fma(auVar41,auVar40,_local_580);
    auVar248 = ZEXT1632(auVar288);
    auVar291 = vsubps_avx(ZEXT832(0) << 0x20,auVar248);
    fVar225 = auVar291._0_4_;
    fVar246 = auVar291._4_4_;
    auVar42._4_4_ = fVar104 * fVar257 * fVar246;
    auVar42._0_4_ = fVar279 * fVar223 * fVar225;
    fVar279 = auVar291._8_4_;
    auVar42._8_4_ = fVar131 * fVar137 * fVar279;
    fVar104 = auVar291._12_4_;
    auVar42._12_4_ = fVar133 * fVar278 * fVar104;
    fVar133 = auVar291._16_4_;
    auVar42._16_4_ = fVar135 * 0.0 * fVar133;
    fVar135 = auVar291._20_4_;
    auVar42._20_4_ = fVar166 * 0.0 * fVar135;
    fVar166 = auVar291._24_4_;
    auVar42._24_4_ = fVar187 * 0.0 * fVar166;
    auVar42._28_4_ = local_aa0._28_4_;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,local_b00);
    auVar277 = ZEXT3264(auVar14);
    auVar288 = vfmadd231ps_fma(auVar42,auVar14,auVar40);
    auVar43._4_4_ = fVar302 * fVar257;
    auVar43._0_4_ = fVar267 * fVar223;
    auVar43._8_4_ = fVar303 * fVar137;
    auVar43._12_4_ = fVar304 * fVar278;
    auVar43._16_4_ = fVar305 * 0.0;
    auVar43._20_4_ = fVar306 * 0.0;
    auVar43._24_4_ = fVar307 * 0.0;
    auVar43._28_4_ = 0;
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar43,_local_600);
    auVar273 = ZEXT1664(auVar114);
    auVar240 = ZEXT832(0) << 0x20;
    auVar154 = vsubps_avx(auVar240,local_ae0);
    auVar288 = vfmadd231ps_fma(ZEXT1632(auVar288),auVar154,auVar43);
    auVar44._4_4_ = fStack_61c * fVar246;
    auVar44._0_4_ = local_620 * fVar225;
    auVar44._8_4_ = fStack_618 * fVar279;
    auVar44._12_4_ = fStack_614 * fVar104;
    auVar44._16_4_ = fStack_610 * fVar133;
    auVar44._20_4_ = fStack_60c * fVar135;
    auVar44._24_4_ = fStack_608 * fVar166;
    auVar44._28_4_ = 0;
    auVar271 = vfmadd231ps_fma(auVar44,_local_580,auVar14);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),_local_600,auVar154);
    fVar209 = auVar288._0_4_;
    fVar258 = auVar114._0_4_;
    fVar222 = auVar288._4_4_;
    fVar265 = auVar114._4_4_;
    fVar224 = auVar288._8_4_;
    fVar266 = auVar114._8_4_;
    fVar131 = auVar288._12_4_;
    fVar267 = auVar114._12_4_;
    auVar45._28_4_ = local_600._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar267 * fVar131,
                            CONCAT48(fVar266 * fVar224,CONCAT44(fVar265 * fVar222,fVar258 * fVar209)
                                    )));
    auVar17 = vsubps_avx(ZEXT1632(auVar271),auVar45);
    auVar46._4_4_ = fVar246 * fVar246;
    auVar46._0_4_ = fVar225 * fVar225;
    auVar46._8_4_ = fVar279 * fVar279;
    auVar46._12_4_ = fVar104 * fVar104;
    auVar46._16_4_ = fVar133 * fVar133;
    auVar46._20_4_ = fVar135 * fVar135;
    auVar46._24_4_ = fVar166 * fVar166;
    auVar46._28_4_ = local_600._28_4_;
    auVar271 = vfmadd231ps_fma(auVar46,auVar14,auVar14);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar154,auVar154);
    local_6e0 = vsubps_avx(ZEXT1632(auVar271),
                           ZEXT1632(CONCAT412(fVar131 * fVar131,
                                              CONCAT48(fVar224 * fVar224,
                                                       CONCAT44(fVar222 * fVar222,fVar209 * fVar209)
                                                      ))));
    local_720 = vsqrtps_avx(auVar125);
    fVar209 = (local_720._0_4_ + auVar233._0_4_) * 1.0000002;
    fVar222 = (local_720._4_4_ + auVar233._4_4_) * 1.0000002;
    fVar224 = (local_720._8_4_ + auVar233._8_4_) * 1.0000002;
    fVar131 = (local_720._12_4_ + auVar233._12_4_) * 1.0000002;
    fVar187 = (local_720._16_4_ + auVar233._16_4_) * 1.0000002;
    fVar188 = (local_720._20_4_ + auVar233._20_4_) * 1.0000002;
    fVar189 = (local_720._24_4_ + auVar233._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar222 * fVar222;
    auVar47._0_4_ = fVar209 * fVar209;
    auVar47._8_4_ = fVar224 * fVar224;
    auVar47._12_4_ = fVar131 * fVar131;
    auVar47._16_4_ = fVar187 * fVar187;
    auVar47._20_4_ = fVar188 * fVar188;
    auVar47._24_4_ = fVar189 * fVar189;
    auVar47._28_4_ = local_720._28_4_ + auVar233._28_4_;
    auVar180._0_4_ = auVar17._0_4_ + auVar17._0_4_;
    auVar180._4_4_ = auVar17._4_4_ + auVar17._4_4_;
    auVar180._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    auVar180._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    auVar180._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    auVar180._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    auVar180._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    auVar180._28_4_ = auVar17._28_4_ + auVar17._28_4_;
    auVar233 = vsubps_avx(local_6e0,auVar47);
    auVar178 = ZEXT1632(auVar114);
    local_9e0 = ZEXT1632(CONCAT412(fVar267 * fVar267,
                                   CONCAT48(fVar266 * fVar266,
                                            CONCAT44(fVar265 * fVar265,fVar258 * fVar258))));
    auVar17 = vsubps_avx(local_240,local_9e0);
    local_700._4_4_ = auVar180._4_4_ * auVar180._4_4_;
    local_700._0_4_ = auVar180._0_4_ * auVar180._0_4_;
    local_700._8_4_ = auVar180._8_4_ * auVar180._8_4_;
    local_700._12_4_ = auVar180._12_4_ * auVar180._12_4_;
    local_700._16_4_ = auVar180._16_4_ * auVar180._16_4_;
    local_700._20_4_ = auVar180._20_4_ * auVar180._20_4_;
    local_700._24_4_ = auVar180._24_4_ * auVar180._24_4_;
    local_700._28_4_ = local_6e0._28_4_;
    fVar222 = auVar17._0_4_;
    local_740 = fVar222 * 4.0;
    fVar224 = auVar17._4_4_;
    fStack_73c = fVar224 * 4.0;
    fVar131 = auVar17._8_4_;
    fStack_738 = fVar131 * 4.0;
    fVar187 = auVar17._12_4_;
    fStack_734 = fVar187 * 4.0;
    fVar188 = auVar17._16_4_;
    fStack_730 = fVar188 * 4.0;
    fVar189 = auVar17._20_4_;
    fStack_72c = fVar189 * 4.0;
    fVar258 = auVar17._24_4_;
    fStack_728 = fVar258 * 4.0;
    fStack_724 = 4.0;
    auVar48._4_4_ = fStack_73c * auVar233._4_4_;
    auVar48._0_4_ = local_740 * auVar233._0_4_;
    auVar48._8_4_ = fStack_738 * auVar233._8_4_;
    auVar48._12_4_ = fStack_734 * auVar233._12_4_;
    auVar48._16_4_ = fStack_730 * auVar233._16_4_;
    auVar48._20_4_ = fStack_72c * auVar233._20_4_;
    auVar48._24_4_ = fStack_728 * auVar233._24_4_;
    auVar48._28_4_ = 0x40800000;
    auVar242 = vsubps_avx(local_700,auVar48);
    auVar125 = vcmpps_avx(auVar242,auVar240,5);
    auVar249 = ZEXT1632(auVar288);
    fVar209 = auVar17._28_4_;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    {
      auVar244 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
    }
    else {
      auVar250 = vcmpps_avx(auVar242,auVar240,5);
      auVar240 = vsqrtps_avx(auVar242);
      auVar289._0_4_ = fVar222 + fVar222;
      auVar289._4_4_ = fVar224 + fVar224;
      auVar289._8_4_ = fVar131 + fVar131;
      auVar289._12_4_ = fVar187 + fVar187;
      auVar289._16_4_ = fVar188 + fVar188;
      auVar289._20_4_ = fVar189 + fVar189;
      auVar289._24_4_ = fVar258 + fVar258;
      auVar289._28_4_ = fVar209 + fVar209;
      auVar242 = vrcpps_avx(auVar289);
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = &DAT_3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar151._16_4_ = 0x3f800000;
      auVar151._20_4_ = 0x3f800000;
      auVar151._24_4_ = 0x3f800000;
      auVar151._28_4_ = 0x3f800000;
      auVar114 = vfnmadd213ps_fma(auVar289,auVar242,auVar151);
      auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar242,auVar242);
      auVar281._0_4_ = (uint)auVar180._0_4_ ^ local_640;
      auVar281._4_4_ = (uint)auVar180._4_4_ ^ uStack_63c;
      auVar281._8_4_ = (uint)auVar180._8_4_ ^ uStack_638;
      auVar281._12_4_ = (uint)auVar180._12_4_ ^ uStack_634;
      auVar281._16_4_ = (uint)auVar180._16_4_ ^ (uint)fStack_630;
      auVar281._20_4_ = (uint)auVar180._20_4_ ^ (uint)fStack_62c;
      auVar281._24_4_ = (uint)auVar180._24_4_ ^ (uint)fStack_628;
      auVar281._28_4_ = (uint)auVar180._28_4_ ^ uStack_624;
      auVar242 = vsubps_avx(auVar281,auVar240);
      auVar49._4_4_ = auVar242._4_4_ * auVar114._4_4_;
      auVar49._0_4_ = auVar242._0_4_ * auVar114._0_4_;
      auVar49._8_4_ = auVar242._8_4_ * auVar114._8_4_;
      auVar49._12_4_ = auVar242._12_4_ * auVar114._12_4_;
      auVar49._16_4_ = auVar242._16_4_ * 0.0;
      auVar49._20_4_ = auVar242._20_4_ * 0.0;
      auVar49._24_4_ = auVar242._24_4_ * 0.0;
      auVar49._28_4_ = auVar242._28_4_;
      auVar242 = vsubps_avx(auVar240,auVar180);
      auVar50._4_4_ = auVar114._4_4_ * auVar242._4_4_;
      auVar50._0_4_ = auVar114._0_4_ * auVar242._0_4_;
      auVar50._8_4_ = auVar114._8_4_ * auVar242._8_4_;
      auVar50._12_4_ = auVar114._12_4_ * auVar242._12_4_;
      auVar50._16_4_ = auVar242._16_4_ * 0.0;
      auVar50._20_4_ = auVar242._20_4_ * 0.0;
      auVar50._24_4_ = auVar242._24_4_ * 0.0;
      auVar50._28_4_ = auVar242._28_4_;
      auVar114 = vfmadd213ps_fma(auVar178,auVar49,auVar249);
      local_540 = ZEXT1632(CONCAT412(fVar278 * auVar114._12_4_,
                                     CONCAT48(fVar137 * auVar114._8_4_,
                                              CONCAT44(fVar257 * auVar114._4_4_,
                                                       fVar223 * auVar114._0_4_))));
      auVar114 = vfmadd213ps_fma(auVar178,auVar50,auVar249);
      local_560 = ZEXT1632(CONCAT412(fVar278 * auVar114._12_4_,
                                     CONCAT48(fVar137 * auVar114._8_4_,
                                              CONCAT44(fVar257 * auVar114._4_4_,
                                                       fVar223 * auVar114._0_4_))));
      auVar120._8_4_ = 0x7f800000;
      auVar120._0_8_ = 0x7f8000007f800000;
      auVar120._12_4_ = 0x7f800000;
      auVar120._16_4_ = 0x7f800000;
      auVar120._20_4_ = 0x7f800000;
      auVar120._24_4_ = 0x7f800000;
      auVar120._28_4_ = 0x7f800000;
      auVar240 = vblendvps_avx(auVar120,auVar49,auVar250);
      auVar242 = vandps_avx(local_9e0,local_7c0);
      auVar242 = vmaxps_avx(local_4a0,auVar242);
      auVar51._4_4_ = auVar242._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar242._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar242._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar242._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar242._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar242._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar242._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar242._28_4_;
      auVar242 = vandps_avx(local_7c0,auVar17);
      auVar242 = vcmpps_avx(auVar242,auVar51,1);
      auVar121._8_4_ = 0xff800000;
      auVar121._0_8_ = 0xff800000ff800000;
      auVar121._12_4_ = 0xff800000;
      auVar121._16_4_ = 0xff800000;
      auVar121._20_4_ = 0xff800000;
      auVar121._24_4_ = 0xff800000;
      auVar121._28_4_ = 0xff800000;
      auVar119 = vblendvps_avx(auVar121,auVar50,auVar250);
      auVar261 = auVar250 & auVar242;
      if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar261 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar261 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar261 >> 0x7f,0) == '\0') &&
            (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar261 >> 0xbf,0) == '\0') &&
          (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar261[0x1f]) {
        auVar244 = ZEXT3264(auVar240);
      }
      else {
        auVar125 = vandps_avx(auVar242,auVar250);
        auVar261 = vcmpps_avx(auVar233,_DAT_02020f00,2);
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
        auVar292._8_4_ = 0x7f800000;
        auVar292._0_8_ = 0x7f8000007f800000;
        auVar292._12_4_ = 0x7f800000;
        auVar292._16_4_ = 0x7f800000;
        auVar292._20_4_ = 0x7f800000;
        auVar292._24_4_ = 0x7f800000;
        auVar292._28_4_ = 0x7f800000;
        auVar233 = vblendvps_avx(auVar292,auVar128,auVar261);
        auVar114 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar280 = vpmovsxwd_avx2(auVar114);
        auVar233 = vblendvps_avx(auVar240,auVar233,auVar280);
        auVar242 = vblendvps_avx(auVar128,auVar292,auVar261);
        auVar119 = vblendvps_avx(auVar119,auVar242,auVar280);
        auVar244 = ZEXT3264(auVar233);
        auVar219._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
        auVar219._8_4_ = auVar125._8_4_ ^ 0xffffffff;
        auVar219._12_4_ = auVar125._12_4_ ^ 0xffffffff;
        auVar219._16_4_ = auVar125._16_4_ ^ 0xffffffff;
        auVar219._20_4_ = auVar125._20_4_ ^ 0xffffffff;
        auVar219._24_4_ = auVar125._24_4_ ^ 0xffffffff;
        auVar219._28_4_ = auVar125._28_4_ ^ 0xffffffff;
        auVar125 = vorps_avx(auVar261,auVar219);
        auVar125 = vandps_avx(auVar250,auVar125);
      }
    }
    auVar233 = local_480 & auVar125;
    auVar286 = ZEXT3264(_local_600);
    if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar233 >> 0x7f,0) == '\0') &&
          (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar233 >> 0xbf,0) == '\0') &&
        (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar233[0x1f])
    {
LAB_01951546:
      auVar235 = ZEXT3264(_local_a80);
    }
    else {
      fVar265 = (ray->org).field_0.m128[3] - (float)local_7f0._0_4_;
      auVar205._4_4_ = fVar265;
      auVar205._0_4_ = fVar265;
      auVar205._8_4_ = fVar265;
      auVar205._12_4_ = fVar265;
      auVar205._16_4_ = fVar265;
      auVar205._20_4_ = fVar265;
      auVar205._24_4_ = fVar265;
      auVar205._28_4_ = fVar265;
      auVar242 = vmaxps_avx(auVar205,auVar244._0_32_);
      auVar52._4_4_ = fVar269 * fVar246;
      auVar52._0_4_ = fVar268 * fVar225;
      auVar52._8_4_ = fVar270 * fVar279;
      auVar52._12_4_ = fVar274 * fVar104;
      auVar52._16_4_ = fVar294 * fVar133;
      auVar52._20_4_ = fVar295 * fVar135;
      auVar52._24_4_ = fVar296 * fVar166;
      auVar52._28_4_ = auVar291._28_4_;
      auVar114 = vfmadd213ps_fma(auVar14,_local_940,auVar52);
      fVar225 = ray->tfar - (float)local_7f0._0_4_;
      auVar206._4_4_ = fVar225;
      auVar206._0_4_ = fVar225;
      auVar206._8_4_ = fVar225;
      auVar206._12_4_ = fVar225;
      auVar206._16_4_ = fVar225;
      auVar206._20_4_ = fVar225;
      auVar206._24_4_ = fVar225;
      auVar206._28_4_ = fVar225;
      auVar288 = vfmadd213ps_fma(auVar154,auVar262,ZEXT1632(auVar114));
      auVar286._0_4_ = fVar268 * local_620;
      auVar286._4_4_ = fVar269 * fStack_61c;
      auVar286._8_4_ = fVar270 * fStack_618;
      auVar286._12_4_ = fVar274 * fStack_614;
      auVar286._16_4_ = fVar294 * fStack_610;
      auVar286._20_4_ = fVar295 * fStack_60c;
      auVar286._28_36_ = auVar244._28_36_;
      auVar286._24_4_ = fVar296 * fStack_608;
      auVar114 = vfmadd231ps_fma(auVar286._0_32_,_local_580,_local_940);
      auVar271 = vfmadd231ps_fma(ZEXT1632(auVar114),_local_600,auVar262);
      auVar233 = vandps_avx(ZEXT1632(auVar271),local_7c0);
      auVar276._8_4_ = 0x219392ef;
      auVar276._0_8_ = 0x219392ef219392ef;
      auVar276._12_4_ = 0x219392ef;
      auVar276._16_4_ = 0x219392ef;
      auVar276._20_4_ = 0x219392ef;
      auVar276._24_4_ = 0x219392ef;
      auVar276._28_4_ = 0x219392ef;
      auVar291 = vcmpps_avx(auVar233,auVar276,1);
      auVar233 = vrcpps_avx(ZEXT1632(auVar271));
      auVar300._8_4_ = 0x3f800000;
      auVar300._0_8_ = &DAT_3f8000003f800000;
      auVar300._12_4_ = 0x3f800000;
      auVar300._16_4_ = 0x3f800000;
      auVar300._20_4_ = 0x3f800000;
      auVar300._24_4_ = 0x3f800000;
      auVar300._28_4_ = 0x3f800000;
      auVar154 = ZEXT1632(auVar271);
      auVar114 = vfnmadd213ps_fma(auVar233,auVar154,auVar300);
      auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar233,auVar233);
      auVar282._0_4_ = auVar271._0_4_ ^ local_640;
      auVar282._4_4_ = auVar271._4_4_ ^ uStack_63c;
      auVar282._8_4_ = auVar271._8_4_ ^ uStack_638;
      auVar282._12_4_ = auVar271._12_4_ ^ uStack_634;
      auVar282._16_4_ = fStack_630;
      auVar282._20_4_ = fStack_62c;
      auVar282._24_4_ = fStack_628;
      auVar282._28_4_ = uStack_624;
      auVar53._4_4_ = auVar114._4_4_ * (float)(auVar288._4_4_ ^ uStack_63c);
      auVar53._0_4_ = auVar114._0_4_ * (float)(auVar288._0_4_ ^ local_640);
      auVar53._8_4_ = auVar114._8_4_ * (float)(auVar288._8_4_ ^ uStack_638);
      auVar53._12_4_ = auVar114._12_4_ * (float)(auVar288._12_4_ ^ uStack_634);
      auVar53._16_4_ = fStack_630 * 0.0;
      auVar53._20_4_ = fStack_62c * 0.0;
      auVar53._24_4_ = fStack_628 * 0.0;
      auVar53._28_4_ = uStack_624;
      auVar233 = vcmpps_avx(auVar154,auVar282,1);
      auVar233 = vorps_avx(auVar291,auVar233);
      auVar301._8_4_ = 0xff800000;
      auVar301._0_8_ = 0xff800000ff800000;
      auVar301._12_4_ = 0xff800000;
      auVar301._16_4_ = 0xff800000;
      auVar301._20_4_ = 0xff800000;
      auVar301._24_4_ = 0xff800000;
      auVar301._28_4_ = 0xff800000;
      auVar233 = vblendvps_avx(auVar53,auVar301,auVar233);
      auVar14 = vminps_avx(auVar206,auVar119);
      _local_920 = vmaxps_avx(auVar242,auVar233);
      auVar233 = vcmpps_avx(auVar154,auVar282,6);
      auVar233 = vorps_avx(auVar291,auVar233);
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar233 = vblendvps_avx(auVar53,auVar241,auVar233);
      auVar14 = vminps_avx(auVar14,auVar233);
      auVar233 = vsubps_avx(ZEXT832(0) << 0x20,local_900);
      auVar291 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar54._4_4_ = auVar291._4_4_ * fVar245;
      auVar54._0_4_ = auVar291._0_4_ * fVar221;
      auVar54._8_4_ = auVar291._8_4_ * fVar247;
      auVar54._12_4_ = auVar291._12_4_ * fVar287;
      auVar54._16_4_ = auVar291._16_4_ * fVar132;
      auVar54._20_4_ = auVar291._20_4_ * fVar134;
      auVar54._24_4_ = auVar291._24_4_ * fVar136;
      auVar54._28_4_ = auVar291._28_4_;
      auVar114 = vfnmsub231ps_fma(auVar54,local_960,auVar233);
      auVar233 = vsubps_avx(ZEXT832(0) << 0x20,auVar149);
      auVar288 = vfnmadd231ps_fma(ZEXT1632(auVar114),local_860,auVar233);
      auVar55._4_4_ = fVar245 * fStack_61c;
      auVar55._0_4_ = fVar221 * local_620;
      auVar55._8_4_ = fVar247 * fStack_618;
      auVar55._12_4_ = fVar287 * fStack_614;
      auVar55._16_4_ = fVar132 * fStack_610;
      auVar55._20_4_ = fVar134 * fStack_60c;
      auVar55._24_4_ = fVar136 * fStack_608;
      auVar55._28_4_ = auVar233._28_4_;
      auVar181._8_4_ = 0x3f800000;
      auVar181._0_8_ = &DAT_3f8000003f800000;
      auVar181._12_4_ = 0x3f800000;
      auVar181._16_4_ = 0x3f800000;
      auVar181._20_4_ = 0x3f800000;
      auVar181._24_4_ = 0x3f800000;
      auVar181._28_4_ = 0x3f800000;
      auVar114 = vfnmsub231ps_fma(auVar55,_local_580,local_960);
      auVar271 = vfnmadd231ps_fma(ZEXT1632(auVar114),local_860,_local_600);
      auVar244 = ZEXT1664(auVar271);
      auVar233 = vandps_avx(ZEXT1632(auVar271),local_7c0);
      auVar154 = vrcpps_avx(ZEXT1632(auVar271));
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar152._16_4_ = 0x219392ef;
      auVar152._20_4_ = 0x219392ef;
      auVar152._24_4_ = 0x219392ef;
      auVar152._28_4_ = 0x219392ef;
      auVar291 = vcmpps_avx(auVar233,auVar152,1);
      auVar277 = ZEXT3264(auVar291);
      auVar242 = ZEXT1632(auVar271);
      auVar114 = vfnmadd213ps_fma(auVar154,auVar242,auVar181);
      auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar154,auVar154);
      auVar283._0_4_ = auVar271._0_4_ ^ local_640;
      auVar283._4_4_ = auVar271._4_4_ ^ uStack_63c;
      auVar283._8_4_ = auVar271._8_4_ ^ uStack_638;
      auVar283._12_4_ = auVar271._12_4_ ^ uStack_634;
      auVar283._16_4_ = fStack_630;
      auVar283._20_4_ = fStack_62c;
      auVar283._24_4_ = fStack_628;
      auVar283._28_4_ = uStack_624;
      auVar286 = ZEXT3264(auVar283);
      auVar56._4_4_ = auVar114._4_4_ * (float)(auVar288._4_4_ ^ uStack_63c);
      auVar56._0_4_ = auVar114._0_4_ * (float)(auVar288._0_4_ ^ local_640);
      auVar56._8_4_ = auVar114._8_4_ * (float)(auVar288._8_4_ ^ uStack_638);
      auVar56._12_4_ = auVar114._12_4_ * (float)(auVar288._12_4_ ^ uStack_634);
      auVar56._16_4_ = fStack_630 * 0.0;
      auVar56._20_4_ = fStack_62c * 0.0;
      auVar56._24_4_ = fStack_628 * 0.0;
      auVar56._28_4_ = uStack_624;
      auVar233 = vcmpps_avx(auVar242,auVar283,1);
      auVar233 = vorps_avx(auVar291,auVar233);
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
      auVar233 = vblendvps_avx(auVar56,auVar122,auVar233);
      _local_8e0 = vmaxps_avx(_local_920,auVar233);
      auVar233 = vcmpps_avx(auVar242,auVar283,6);
      auVar233 = vorps_avx(auVar291,auVar233);
      auVar153._8_4_ = 0x7f800000;
      auVar153._0_8_ = 0x7f8000007f800000;
      auVar153._12_4_ = 0x7f800000;
      auVar153._16_4_ = 0x7f800000;
      auVar153._20_4_ = 0x7f800000;
      auVar153._24_4_ = 0x7f800000;
      auVar153._28_4_ = 0x7f800000;
      auVar233 = vblendvps_avx(auVar56,auVar153,auVar233);
      auVar125 = vandps_avx(auVar125,local_480);
      local_500 = vminps_avx(auVar14,auVar233);
      auVar233 = vcmpps_avx(_local_8e0,local_500,2);
      auVar291 = auVar125 & auVar233;
      if ((((((((auVar291 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar291 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar291 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar291 >> 0x7f,0) == '\0') &&
            (auVar291 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar291 >> 0xbf,0) == '\0') &&
          (auVar291 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar291[0x1f]) goto LAB_01951546;
      auVar291 = vminps_avx(local_540,auVar181);
      auVar70 = ZEXT412(0);
      auVar286 = ZEXT1264(auVar70) << 0x20;
      auVar291 = vmaxps_avx(auVar291,ZEXT1232(auVar70) << 0x20);
      auVar14 = vminps_avx(local_560,auVar181);
      auVar14 = vmaxps_avx(auVar14,ZEXT1232(auVar70) << 0x20);
      auVar57._4_4_ = (auVar291._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar291._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar291._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar291._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar291._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar291._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar291._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar291._28_4_ + 7.0;
      auVar114 = vfmadd213ps_fma(auVar57,local_6c0,local_980);
      auVar58._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar14._28_4_ + 7.0;
      auVar288 = vfmadd213ps_fma(auVar58,local_6c0,local_980);
      auVar154 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar291 = vminps_avx(auVar177,auVar238);
      auVar14 = vminps_avx(local_8a0,_local_8c0);
      auVar291 = vminps_avx(auVar291,auVar14);
      auVar291 = vsubps_avx(auVar291,local_720);
      auVar125 = vandps_avx(auVar233,auVar125);
      local_540 = ZEXT1632(auVar114);
      local_560 = ZEXT1632(auVar288);
      auVar59._4_4_ = auVar291._4_4_ * 0.99999976;
      auVar59._0_4_ = auVar291._0_4_ * 0.99999976;
      auVar59._8_4_ = auVar291._8_4_ * 0.99999976;
      auVar59._12_4_ = auVar291._12_4_ * 0.99999976;
      auVar59._16_4_ = auVar291._16_4_ * 0.99999976;
      auVar59._20_4_ = auVar291._20_4_ * 0.99999976;
      auVar59._24_4_ = auVar291._24_4_ * 0.99999976;
      auVar59._28_4_ = auVar291._28_4_;
      auVar233 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar59);
      auVar60._4_4_ = auVar233._4_4_ * auVar233._4_4_;
      auVar60._0_4_ = auVar233._0_4_ * auVar233._0_4_;
      auVar60._8_4_ = auVar233._8_4_ * auVar233._8_4_;
      auVar60._12_4_ = auVar233._12_4_ * auVar233._12_4_;
      auVar60._16_4_ = auVar233._16_4_ * auVar233._16_4_;
      auVar60._20_4_ = auVar233._20_4_ * auVar233._20_4_;
      auVar60._24_4_ = auVar233._24_4_ * auVar233._24_4_;
      auVar60._28_4_ = auVar233._28_4_;
      auVar291 = vsubps_avx(local_6e0,auVar60);
      auVar61._4_4_ = auVar291._4_4_ * fStack_73c;
      auVar61._0_4_ = auVar291._0_4_ * local_740;
      auVar61._8_4_ = auVar291._8_4_ * fStack_738;
      auVar61._12_4_ = auVar291._12_4_ * fStack_734;
      auVar61._16_4_ = auVar291._16_4_ * fStack_730;
      auVar61._20_4_ = auVar291._20_4_ * fStack_72c;
      auVar61._24_4_ = auVar291._24_4_ * fStack_728;
      auVar61._28_4_ = auVar233._28_4_;
      auVar14 = vsubps_avx(local_700,auVar61);
      local_b20 = vcmpps_avx(auVar14,ZEXT1232(auVar70) << 0x20,5);
      auVar233 = local_b20;
      if ((((((((local_b20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_b20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_b20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_b20 >> 0x7f,0) == '\0') &&
            (local_b20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_b20 >> 0xbf,0) == '\0') &&
          (local_b20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_b20[0x1f]) {
        auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
        local_680 = ZEXT832(0) << 0x20;
        _local_6a0 = ZEXT832(0) << 0x20;
        auVar220 = ZEXT864(0) << 0x20;
        auVar243._8_4_ = 0x7f800000;
        auVar243._0_8_ = 0x7f8000007f800000;
        auVar243._12_4_ = 0x7f800000;
        auVar243._16_4_ = 0x7f800000;
        auVar243._20_4_ = 0x7f800000;
        auVar243._24_4_ = 0x7f800000;
        auVar243._28_4_ = 0x7f800000;
        auVar252._8_4_ = 0xff800000;
        auVar252._0_8_ = 0xff800000ff800000;
        auVar252._12_4_ = 0xff800000;
        auVar252._16_4_ = 0xff800000;
        auVar252._20_4_ = 0xff800000;
        auVar252._24_4_ = 0xff800000;
        auVar252._28_4_ = 0xff800000;
        local_b20 = auVar149;
        local_660 = local_680;
      }
      else {
        auVar242 = vsqrtps_avx(auVar14);
        auVar253._0_4_ = fVar222 + fVar222;
        auVar253._4_4_ = fVar224 + fVar224;
        auVar253._8_4_ = fVar131 + fVar131;
        auVar253._12_4_ = fVar187 + fVar187;
        auVar253._16_4_ = fVar188 + fVar188;
        auVar253._20_4_ = fVar189 + fVar189;
        auVar253._24_4_ = fVar258 + fVar258;
        auVar253._28_4_ = fVar209 + fVar209;
        auVar154 = vrcpps_avx(auVar253);
        auVar114 = vfnmadd213ps_fma(auVar253,auVar154,auVar181);
        auVar114 = vfmadd132ps_fma(ZEXT1632(auVar114),auVar154,auVar154);
        auVar284._0_4_ = (uint)auVar180._0_4_ ^ local_640;
        auVar284._4_4_ = (uint)auVar180._4_4_ ^ uStack_63c;
        auVar284._8_4_ = (uint)auVar180._8_4_ ^ uStack_638;
        auVar284._12_4_ = (uint)auVar180._12_4_ ^ uStack_634;
        auVar284._16_4_ = (uint)auVar180._16_4_ ^ (uint)fStack_630;
        auVar284._20_4_ = (uint)auVar180._20_4_ ^ (uint)fStack_62c;
        auVar284._24_4_ = (uint)auVar180._24_4_ ^ (uint)fStack_628;
        auVar284._28_4_ = (uint)auVar180._28_4_ ^ uStack_624;
        auVar154 = vsubps_avx(auVar284,auVar242);
        auVar149 = vsubps_avx(auVar242,auVar180);
        fVar209 = auVar154._0_4_ * auVar114._0_4_;
        fVar221 = auVar154._4_4_ * auVar114._4_4_;
        auVar62._4_4_ = fVar221;
        auVar62._0_4_ = fVar209;
        fVar225 = auVar154._8_4_ * auVar114._8_4_;
        auVar62._8_4_ = fVar225;
        fVar245 = auVar154._12_4_ * auVar114._12_4_;
        auVar62._12_4_ = fVar245;
        fVar246 = auVar154._16_4_ * 0.0;
        auVar62._16_4_ = fVar246;
        fVar222 = auVar154._20_4_ * 0.0;
        auVar62._20_4_ = fVar222;
        fVar247 = auVar154._24_4_ * 0.0;
        auVar62._24_4_ = fVar247;
        auVar62._28_4_ = auVar242._28_4_;
        fVar279 = auVar149._0_4_ * auVar114._0_4_;
        fVar224 = auVar149._4_4_ * auVar114._4_4_;
        auVar63._4_4_ = fVar224;
        auVar63._0_4_ = fVar279;
        fVar287 = auVar149._8_4_ * auVar114._8_4_;
        auVar63._8_4_ = fVar287;
        fVar104 = auVar149._12_4_ * auVar114._12_4_;
        auVar63._12_4_ = fVar104;
        fVar131 = auVar149._16_4_ * 0.0;
        auVar63._16_4_ = fVar131;
        fVar132 = auVar149._20_4_ * 0.0;
        auVar63._20_4_ = fVar132;
        fVar133 = auVar149._24_4_ * 0.0;
        auVar63._24_4_ = fVar133;
        auVar63._28_4_ = auVar154._28_4_;
        auVar286 = ZEXT3264(auVar63);
        auVar114 = vfmadd213ps_fma(auVar178,auVar62,auVar249);
        auVar288 = vfmadd213ps_fma(auVar178,auVar63,auVar249);
        auVar154 = ZEXT1632(CONCAT412(fVar278 * auVar114._12_4_,
                                      CONCAT48(fVar137 * auVar114._8_4_,
                                               CONCAT44(fVar257 * auVar114._4_4_,
                                                        fVar223 * auVar114._0_4_))));
        auVar242 = ZEXT1632(CONCAT412(fVar278 * auVar288._12_4_,
                                      CONCAT48(fVar137 * auVar288._8_4_,
                                               CONCAT44(fVar257 * auVar288._4_4_,
                                                        fVar223 * auVar288._0_4_))));
        auVar114 = vfmadd213ps_fma(auVar15,auVar154,local_ae0);
        auVar288 = vfmadd213ps_fma(auVar15,auVar242,local_ae0);
        auVar271 = vfmadd213ps_fma(auVar16,auVar154,local_b00);
        auVar4 = vfmadd213ps_fma(auVar16,auVar242,local_b00);
        auVar141 = vfmadd213ps_fma(auVar154,auVar123,auVar248);
        auVar146 = vfmadd213ps_fma(auVar123,auVar242,auVar248);
        auVar64._4_4_ = (float)local_600._4_4_ * fVar221;
        auVar64._0_4_ = (float)local_600._0_4_ * fVar209;
        auVar64._8_4_ = fStack_5f8 * fVar225;
        auVar64._12_4_ = fStack_5f4 * fVar245;
        auVar64._16_4_ = fStack_5f0 * fVar246;
        auVar64._20_4_ = fStack_5ec * fVar222;
        auVar64._24_4_ = fStack_5e8 * fVar247;
        auVar64._28_4_ = 0;
        auVar123 = vsubps_avx(auVar64,ZEXT1632(auVar114));
        auVar155._0_4_ = (float)local_580._0_4_ * fVar209;
        auVar155._4_4_ = (float)local_580._4_4_ * fVar221;
        auVar155._8_4_ = fStack_578 * fVar225;
        auVar155._12_4_ = fStack_574 * fVar245;
        auVar155._16_4_ = fStack_570 * fVar246;
        auVar155._20_4_ = fStack_56c * fVar222;
        auVar155._24_4_ = fStack_568 * fVar247;
        auVar155._28_4_ = 0;
        auVar154 = vsubps_avx(auVar155,ZEXT1632(auVar271));
        auVar182._0_4_ = local_620 * fVar209;
        auVar182._4_4_ = fStack_61c * fVar221;
        auVar182._8_4_ = fStack_618 * fVar225;
        auVar182._12_4_ = fStack_614 * fVar245;
        auVar182._16_4_ = fStack_610 * fVar246;
        auVar182._20_4_ = fStack_60c * fVar222;
        auVar182._24_4_ = fStack_608 * fVar247;
        auVar182._28_4_ = 0;
        auVar15 = vsubps_avx(auVar182,ZEXT1632(auVar141));
        auVar220 = ZEXT3264(auVar15);
        auVar254._0_4_ = (float)local_600._0_4_ * fVar279;
        auVar254._4_4_ = (float)local_600._4_4_ * fVar224;
        auVar254._8_4_ = fStack_5f8 * fVar287;
        auVar254._12_4_ = fStack_5f4 * fVar104;
        auVar254._16_4_ = fStack_5f0 * fVar131;
        auVar254._20_4_ = fStack_5ec * fVar132;
        auVar254._24_4_ = fStack_5e8 * fVar133;
        auVar254._28_4_ = 0;
        local_660 = vsubps_avx(auVar254,ZEXT1632(auVar288));
        auVar65._4_4_ = (float)local_580._4_4_ * fVar224;
        auVar65._0_4_ = (float)local_580._0_4_ * fVar279;
        auVar65._8_4_ = fStack_578 * fVar287;
        auVar65._12_4_ = fStack_574 * fVar104;
        auVar65._16_4_ = fStack_570 * fVar131;
        auVar65._20_4_ = fStack_56c * fVar132;
        auVar65._24_4_ = fStack_568 * fVar133;
        auVar65._28_4_ = local_660._28_4_;
        local_680 = vsubps_avx(auVar65,ZEXT1632(auVar4));
        auVar66._4_4_ = fStack_61c * fVar224;
        auVar66._0_4_ = local_620 * fVar279;
        auVar66._8_4_ = fStack_618 * fVar287;
        auVar66._12_4_ = fStack_614 * fVar104;
        auVar66._16_4_ = fStack_610 * fVar131;
        auVar66._20_4_ = fStack_60c * fVar132;
        auVar66._24_4_ = fStack_608 * fVar133;
        auVar66._28_4_ = local_680._28_4_;
        _local_6a0 = vsubps_avx(auVar66,ZEXT1632(auVar146));
        auVar15 = vcmpps_avx(auVar14,_DAT_02020f00,5);
        auVar264 = ZEXT3264(auVar15);
        auVar255._8_4_ = 0x7f800000;
        auVar255._0_8_ = 0x7f8000007f800000;
        auVar255._12_4_ = 0x7f800000;
        auVar255._16_4_ = 0x7f800000;
        auVar255._20_4_ = 0x7f800000;
        auVar255._24_4_ = 0x7f800000;
        auVar255._28_4_ = 0x7f800000;
        auVar243 = vblendvps_avx(auVar255,auVar62,auVar15);
        auVar14 = vandps_avx(local_7c0,local_9e0);
        auVar14 = vmaxps_avx(local_4a0,auVar14);
        auVar67._4_4_ = auVar14._4_4_ * 1.9073486e-06;
        auVar67._0_4_ = auVar14._0_4_ * 1.9073486e-06;
        auVar67._8_4_ = auVar14._8_4_ * 1.9073486e-06;
        auVar67._12_4_ = auVar14._12_4_ * 1.9073486e-06;
        auVar67._16_4_ = auVar14._16_4_ * 1.9073486e-06;
        auVar67._20_4_ = auVar14._20_4_ * 1.9073486e-06;
        auVar67._24_4_ = auVar14._24_4_ * 1.9073486e-06;
        auVar67._28_4_ = auVar14._28_4_;
        auVar14 = vandps_avx(local_7c0,auVar17);
        auVar14 = vcmpps_avx(auVar14,auVar67,1);
        auVar256._8_4_ = 0xff800000;
        auVar256._0_8_ = 0xff800000ff800000;
        auVar256._12_4_ = 0xff800000;
        auVar256._16_4_ = 0xff800000;
        auVar256._20_4_ = 0xff800000;
        auVar256._24_4_ = 0xff800000;
        auVar256._28_4_ = 0xff800000;
        auVar252 = vblendvps_avx(auVar256,auVar63,auVar15);
        auVar16 = auVar15 & auVar14;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          auVar233 = vandps_avx(auVar14,auVar15);
          auVar14 = vcmpps_avx(auVar291,ZEXT832(0) << 0x20,2);
          auVar285._8_4_ = 0xff800000;
          auVar285._0_8_ = 0xff800000ff800000;
          auVar285._12_4_ = 0xff800000;
          auVar285._16_4_ = 0xff800000;
          auVar285._20_4_ = 0xff800000;
          auVar285._24_4_ = 0xff800000;
          auVar285._28_4_ = 0xff800000;
          auVar286 = ZEXT3264(auVar285);
          auVar293._8_4_ = 0x7f800000;
          auVar293._0_8_ = 0x7f8000007f800000;
          auVar293._12_4_ = 0x7f800000;
          auVar293._16_4_ = 0x7f800000;
          auVar293._20_4_ = 0x7f800000;
          auVar293._24_4_ = 0x7f800000;
          auVar293._28_4_ = 0x7f800000;
          auVar291 = vblendvps_avx(auVar293,auVar285,auVar14);
          auVar114 = vpackssdw_avx(auVar233._0_16_,auVar233._16_16_);
          auVar16 = vpmovsxwd_avx2(auVar114);
          auVar243 = vblendvps_avx(auVar243,auVar291,auVar16);
          auVar291 = vblendvps_avx(auVar285,auVar293,auVar14);
          auVar252 = vblendvps_avx(auVar252,auVar291,auVar16);
          auVar234._0_8_ = auVar233._0_8_ ^ 0xffffffffffffffff;
          auVar234._8_4_ = auVar233._8_4_ ^ 0xffffffff;
          auVar234._12_4_ = auVar233._12_4_ ^ 0xffffffff;
          auVar234._16_4_ = auVar233._16_4_ ^ 0xffffffff;
          auVar234._20_4_ = auVar233._20_4_ ^ 0xffffffff;
          auVar234._24_4_ = auVar233._24_4_ ^ 0xffffffff;
          auVar234._28_4_ = auVar233._28_4_ ^ 0xffffffff;
          auVar233 = vorps_avx(auVar14,auVar234);
          auVar233 = vandps_avx(auVar15,auVar233);
        }
      }
      uVar101 = *(undefined4 *)&(ray->dir).field_0;
      local_880._4_4_ = uVar101;
      local_880._0_4_ = uVar101;
      local_880._8_4_ = uVar101;
      local_880._12_4_ = uVar101;
      local_880._16_4_ = uVar101;
      local_880._20_4_ = uVar101;
      local_880._24_4_ = uVar101;
      local_880._28_4_ = uVar101;
      auVar277 = ZEXT3264(local_880);
      uVar101 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar290._4_4_ = uVar101;
      auVar290._0_4_ = uVar101;
      auVar290._8_4_ = uVar101;
      auVar290._12_4_ = uVar101;
      auVar290._16_4_ = uVar101;
      auVar290._20_4_ = uVar101;
      auVar290._24_4_ = uVar101;
      auVar290._28_4_ = uVar101;
      fVar209 = (ray->dir).field_0.m128[2];
      auVar273 = ZEXT3264(_local_8e0);
      local_4e0 = _local_8e0;
      local_4c0 = vminps_avx(local_500,auVar243);
      _local_520 = vmaxps_avx(_local_8e0,auVar252);
      auVar244 = ZEXT3264(_local_520);
      auVar291 = vcmpps_avx(_local_8e0,local_4c0,2);
      local_5a0 = vandps_avx(auVar291,auVar125);
      auVar291 = vcmpps_avx(_local_520,local_500,2);
      local_5e0 = vandps_avx(auVar291,auVar125);
      auVar125 = vorps_avx(local_5e0,local_5a0);
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar125[0x1f]) goto LAB_01951546;
      local_2e0 = local_5e0;
      _local_2c0 = _local_520;
      local_300._0_8_ = auVar233._0_8_ ^ 0xffffffffffffffff;
      local_300._8_4_ = auVar233._8_4_ ^ 0xffffffff;
      local_300._12_4_ = auVar233._12_4_ ^ 0xffffffff;
      local_300._16_4_ = auVar233._16_4_ ^ 0xffffffff;
      local_300._20_4_ = auVar233._20_4_ ^ 0xffffffff;
      local_300._24_4_ = auVar233._24_4_ ^ 0xffffffff;
      local_300._28_4_ = auVar233._28_4_ ^ 0xffffffff;
      auVar235._0_4_ = fVar209 * auVar220._0_4_;
      auVar235._4_4_ = fVar209 * auVar220._4_4_;
      auVar235._8_4_ = fVar209 * auVar220._8_4_;
      auVar235._12_4_ = fVar209 * auVar220._12_4_;
      auVar235._16_4_ = fVar209 * auVar220._16_4_;
      auVar235._20_4_ = fVar209 * auVar220._20_4_;
      auVar235._28_36_ = auVar220._28_36_;
      auVar235._24_4_ = fVar209 * auVar220._24_4_;
      auVar114 = vfmadd213ps_fma(auVar154,auVar290,auVar235._0_32_);
      auVar114 = vfmadd213ps_fma(auVar123,local_880,ZEXT1632(auVar114));
      auVar125 = vandps_avx(ZEXT1632(auVar114),local_7c0);
      auVar158._8_4_ = 0x3e99999a;
      auVar158._0_8_ = 0x3e99999a3e99999a;
      auVar158._12_4_ = 0x3e99999a;
      auVar158._16_4_ = 0x3e99999a;
      auVar158._20_4_ = 0x3e99999a;
      auVar158._24_4_ = 0x3e99999a;
      auVar158._28_4_ = 0x3e99999a;
      auVar125 = vcmpps_avx(auVar125,auVar158,1);
      auVar125 = vorps_avx(auVar125,local_300);
      auVar159._8_4_ = 3;
      auVar159._0_8_ = 0x300000003;
      auVar159._12_4_ = 3;
      auVar159._16_4_ = 3;
      auVar159._20_4_ = 3;
      auVar159._24_4_ = 3;
      auVar159._28_4_ = 3;
      auVar184._8_4_ = 2;
      auVar184._0_8_ = 0x200000002;
      auVar184._12_4_ = 2;
      auVar184._16_4_ = 2;
      auVar184._20_4_ = 2;
      auVar184._24_4_ = 2;
      auVar184._28_4_ = 2;
      auVar125 = vblendvps_avx(auVar184,auVar159,auVar125);
      uVar101 = (undefined4)uVar102;
      local_320._4_4_ = uVar101;
      local_320._0_4_ = uVar101;
      local_320._8_4_ = uVar101;
      local_320._12_4_ = uVar101;
      local_320._16_4_ = uVar101;
      local_320._20_4_ = uVar101;
      local_320._24_4_ = uVar101;
      local_320._28_4_ = uVar101;
      local_2a0 = vpcmpgtd_avx2(auVar125,local_320);
      local_5c0 = vpandn_avx2(local_2a0,local_5a0);
      auVar220 = ZEXT3264(local_5c0);
      auVar125 = local_5a0 & ~local_2a0;
      auStack_778 = auVar17._8_24_;
      local_780 = uVar102;
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar125[0x1f]) {
        auVar235 = ZEXT3264(_local_a80);
        auVar291 = local_880;
        fVar225 = fVar209;
        fVar245 = fVar209;
        fVar257 = fVar209;
        fVar246 = fVar209;
        fVar222 = fVar209;
        fVar247 = fVar209;
        local_880._16_16_ = auVar239;
      }
      else {
        auVar288 = vminps_avx(local_a20,local_a40);
        auVar114 = vmaxps_avx(local_a20,local_a40);
        auVar271 = vminps_avx(local_a30,_local_a50);
        auVar4 = vminps_avx(auVar288,auVar271);
        auVar288 = vmaxps_avx(local_a30,_local_a50);
        auVar271 = vmaxps_avx(auVar114,auVar288);
        auVar191._8_4_ = 0x7fffffff;
        auVar191._0_8_ = 0x7fffffff7fffffff;
        auVar191._12_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar4,auVar191);
        local_6e0._0_16_ = auVar191;
        auVar288 = vandps_avx(auVar271,auVar191);
        auVar114 = vmaxps_avx(auVar114,auVar288);
        auVar288 = vmovshdup_avx(auVar114);
        auVar288 = vmaxss_avx(auVar288,auVar114);
        auVar114 = vshufpd_avx(auVar114,auVar114,1);
        auVar114 = vmaxss_avx(auVar114,auVar288);
        local_920 = (undefined1  [4])(auVar114._0_4_ * 1.9073486e-06);
        auVar114 = vshufps_avx(auVar271,auVar271,0xff);
        local_760 = ZEXT1632(auVar114);
        local_7a0._4_4_ = (float)local_8e0._4_4_ + (float)local_a80._4_4_;
        local_7a0._0_4_ = (float)local_8e0._0_4_ + (float)local_a80._0_4_;
        fStack_798 = fStack_8d8 + fStack_a78;
        fStack_794 = fStack_8d4 + fStack_a74;
        fStack_790 = fStack_8d0 + fStack_a70;
        fStack_78c = fStack_8cc + fStack_a6c;
        fStack_788 = fStack_8c8 + fStack_a68;
        fStack_784 = fStack_8c4 + fStack_a64;
        local_8c0._4_4_ = fVar209;
        local_8c0._0_4_ = fVar209;
        fStack_8b8 = fVar209;
        fStack_8b4 = fVar209;
        fStack_8b0 = fVar209;
        fStack_8ac = fVar209;
        fStack_8a8 = fVar209;
        fStack_8a4 = fVar209;
        local_8a0 = auVar290;
        do {
          auVar160._8_4_ = 0x7f800000;
          auVar160._0_8_ = 0x7f8000007f800000;
          auVar160._12_4_ = 0x7f800000;
          auVar160._16_4_ = 0x7f800000;
          auVar160._20_4_ = 0x7f800000;
          auVar160._24_4_ = 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar125 = auVar220._0_32_;
          auVar233 = vblendvps_avx(auVar160,_local_8e0,auVar125);
          auVar291 = vshufps_avx(auVar233,auVar233,0xb1);
          auVar291 = vminps_avx(auVar233,auVar291);
          auVar14 = vshufpd_avx(auVar291,auVar291,5);
          auVar291 = vminps_avx(auVar291,auVar14);
          auVar14 = vpermpd_avx2(auVar291,0x4e);
          auVar291 = vminps_avx(auVar291,auVar14);
          auVar233 = vcmpps_avx(auVar233,auVar291,0);
          auVar291 = auVar125 & auVar233;
          if ((((((((auVar291 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar291 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar291 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar291 >> 0x7f,0) != '\0') ||
                (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar291 >> 0xbf,0) != '\0') ||
              (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar291[0x1f] < '\0') {
            auVar125 = vandps_avx(auVar233,auVar125);
          }
          uVar96 = vmovmskps_avx(auVar125);
          iVar18 = 0;
          for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          uVar96 = iVar18 << 2;
          *(undefined4 *)(local_5c0 + uVar96) = 0;
          aVar2 = (ray->dir).field_0;
          local_820._0_16_ = (undefined1  [16])aVar2;
          auVar114 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          auVar273 = ZEXT464(*(uint *)(local_540 + uVar96));
          local_ae0._0_16_ = ZEXT416(*(uint *)(local_4e0 + uVar96));
          if (auVar114._0_4_ < 0.0) {
            local_b00._0_16_ = ZEXT416(*(uint *)(local_540 + uVar96));
            fVar209 = sqrtf(auVar114._0_4_);
            auVar273 = ZEXT1664(local_b00._0_16_);
          }
          else {
            auVar114 = vsqrtss_avx(auVar114,auVar114);
            fVar209 = auVar114._0_4_;
          }
          local_6c0._0_4_ = fVar209 * 1.9073486e-06;
          lVar99 = 5;
          do {
            fVar223 = auVar273._0_4_;
            fVar257 = 1.0 - fVar223;
            fVar245 = fVar257 * fVar257 * fVar257;
            fVar209 = fVar223 * fVar223;
            fVar225 = fVar223 * fVar209;
            auVar288 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                       ZEXT416((uint)fVar225));
            fVar221 = fVar223 * fVar257;
            auVar271 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar221 * 6.0)),
                                       ZEXT416((uint)(fVar257 * fVar221)),
                                       SUB6416(ZEXT464(0x41400000),0));
            auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar221 * 6.0)),
                                     SUB6416(ZEXT464(0x41400000),0),
                                     ZEXT416((uint)(fVar223 * fVar221)));
            auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                       ZEXT416((uint)fVar245));
            fVar223 = (auVar114._0_4_ + auVar4._0_4_) * 0.16666667;
            fVar225 = fVar225 * 0.16666667;
            auVar139._0_4_ = fVar225 * (float)local_a50._0_4_;
            auVar139._4_4_ = fVar225 * (float)local_a50._4_4_;
            auVar139._8_4_ = fVar225 * fStack_a48;
            auVar139._12_4_ = fVar225 * fStack_a44;
            auVar192._4_4_ = fVar223;
            auVar192._0_4_ = fVar223;
            auVar192._8_4_ = fVar223;
            auVar192._12_4_ = fVar223;
            auVar114 = vfmadd132ps_fma(auVar192,auVar139,local_a30);
            fVar223 = (auVar288._0_4_ + auVar271._0_4_) * 0.16666667;
            auVar140._4_4_ = fVar223;
            auVar140._0_4_ = fVar223;
            auVar140._8_4_ = fVar223;
            auVar140._12_4_ = fVar223;
            auVar114 = vfmadd132ps_fma(auVar140,auVar114,local_a40);
            auVar169._4_4_ = local_ae0._0_4_;
            auVar169._0_4_ = local_ae0._0_4_;
            auVar169._8_4_ = local_ae0._0_4_;
            auVar169._12_4_ = local_ae0._0_4_;
            auVar288 = vfmadd213ps_fma(auVar169,local_820._0_16_,_DAT_01feba10);
            fVar245 = fVar245 * 0.16666667;
            auVar109._4_4_ = fVar245;
            auVar109._0_4_ = fVar245;
            auVar109._8_4_ = fVar245;
            auVar109._12_4_ = fVar245;
            auVar114 = vfmadd132ps_fma(auVar109,auVar114,local_a20);
            local_860._0_16_ = auVar114;
            auVar114 = vsubps_avx(auVar288,auVar114);
            _local_940 = auVar114;
            auVar114 = vdpps_avx(auVar114,auVar114,0x7f);
            local_b00._0_16_ = auVar273._0_16_;
            local_b20._0_16_ = auVar114;
            if (auVar114._0_4_ < 0.0) {
              local_900._0_16_ = ZEXT416((uint)fVar257);
              local_840._0_4_ = fVar209;
              local_aa0._0_4_ = fVar221;
              auVar220._0_4_ = sqrtf(auVar114._0_4_);
              auVar220._4_60_ = extraout_var;
              auVar114 = auVar220._0_16_;
              fVar221 = (float)local_aa0._0_4_;
              auVar288 = local_900._0_16_;
              auVar271 = local_b00._0_16_;
            }
            else {
              auVar114 = vsqrtss_avx(auVar114,auVar114);
              local_840._0_4_ = fVar209;
              auVar288 = ZEXT416((uint)fVar257);
              auVar271 = auVar273._0_16_;
            }
            auVar286 = ZEXT1664(auVar114);
            fVar209 = auVar288._0_4_;
            auVar110._4_4_ = fVar209;
            auVar110._0_4_ = fVar209;
            auVar110._8_4_ = fVar209;
            auVar110._12_4_ = fVar209;
            auVar141 = vfnmsub213ss_fma(auVar271,auVar271,ZEXT416((uint)(fVar221 * 4.0)));
            auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * 4.0)),auVar288,auVar288);
            fVar209 = fVar209 * -fVar209 * 0.5;
            fVar221 = auVar141._0_4_ * 0.5;
            fVar223 = auVar4._0_4_ * 0.5;
            local_840._0_4_ = (float)local_840._0_4_ * 0.5;
            auVar228._0_4_ = (float)local_a50._0_4_ * (float)local_840._0_4_;
            auVar228._4_4_ = (float)local_a50._4_4_ * (float)local_840._0_4_;
            auVar228._8_4_ = fStack_a48 * (float)local_840._0_4_;
            auVar228._12_4_ = fStack_a44 * (float)local_840._0_4_;
            auVar193._4_4_ = fVar223;
            auVar193._0_4_ = fVar223;
            auVar193._8_4_ = fVar223;
            auVar193._12_4_ = fVar223;
            auVar4 = vfmadd213ps_fma(auVar193,local_a30,auVar228);
            auVar211._4_4_ = fVar221;
            auVar211._0_4_ = fVar221;
            auVar211._8_4_ = fVar221;
            auVar211._12_4_ = fVar221;
            auVar4 = vfmadd213ps_fma(auVar211,local_a40,auVar4);
            auVar275._4_4_ = fVar209;
            auVar275._0_4_ = fVar209;
            auVar275._8_4_ = fVar209;
            auVar275._12_4_ = fVar209;
            local_840._0_16_ = vfmadd213ps_fma(auVar275,local_a20,auVar4);
            auVar277 = ZEXT1664(local_840._0_16_);
            auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar288,auVar271);
            auVar288 = vfmadd231ss_fma(auVar288,auVar271,SUB6416(ZEXT464(0xc0000000),0));
            fVar209 = auVar271._0_4_;
            auVar194._0_4_ = (float)local_a50._0_4_ * fVar209;
            auVar194._4_4_ = (float)local_a50._4_4_ * fVar209;
            auVar194._8_4_ = fStack_a48 * fVar209;
            auVar194._12_4_ = fStack_a44 * fVar209;
            uVar101 = auVar288._0_4_;
            auVar212._4_4_ = uVar101;
            auVar212._0_4_ = uVar101;
            auVar212._8_4_ = uVar101;
            auVar212._12_4_ = uVar101;
            auVar288 = vfmadd213ps_fma(auVar212,local_a30,auVar194);
            auVar170._0_4_ = auVar4._0_4_;
            auVar170._4_4_ = auVar170._0_4_;
            auVar170._8_4_ = auVar170._0_4_;
            auVar170._12_4_ = auVar170._0_4_;
            auVar288 = vfmadd213ps_fma(auVar170,local_a40,auVar288);
            auVar141 = vfmadd231ps_fma(auVar288,local_a20,auVar110);
            auVar271 = vdpps_avx(local_840._0_16_,local_840._0_16_,0x7f);
            auVar288 = vblendps_avx(auVar271,_DAT_01feba10,0xe);
            auVar4 = vrsqrtss_avx(auVar288,auVar288);
            fVar209 = auVar4._0_4_;
            fVar223 = auVar271._0_4_;
            fVar209 = fVar209 * 1.5 + fVar223 * -0.5 * fVar209 * fVar209 * fVar209;
            auVar4 = vdpps_avx(local_840._0_16_,auVar141,0x7f);
            auVar171._0_4_ = auVar141._0_4_ * fVar223;
            auVar171._4_4_ = auVar141._4_4_ * fVar223;
            auVar171._8_4_ = auVar141._8_4_ * fVar223;
            auVar171._12_4_ = auVar141._12_4_ * fVar223;
            fVar221 = auVar4._0_4_;
            auVar229._0_4_ = local_840._0_4_ * fVar221;
            auVar229._4_4_ = local_840._4_4_ * fVar221;
            fVar225 = local_840._8_4_;
            auVar229._8_4_ = fVar225 * fVar221;
            fVar245 = local_840._12_4_;
            auVar229._12_4_ = fVar245 * fVar221;
            auVar4 = vsubps_avx(auVar171,auVar229);
            auVar288 = vrcpss_avx(auVar288,auVar288);
            auVar141 = vfnmadd213ss_fma(auVar288,auVar271,ZEXT416(0x40000000));
            fVar221 = auVar288._0_4_ * auVar141._0_4_;
            auVar288 = vmaxss_avx(ZEXT416((uint)local_920),
                                  ZEXT416((uint)((float)local_ae0._0_4_ * (float)local_6c0._0_4_)));
            local_900._0_4_ = auVar288._0_4_;
            auVar259._0_8_ = local_840._0_8_ ^ 0x8000000080000000;
            auVar259._8_4_ = -fVar225;
            auVar259._12_4_ = -fVar245;
            local_980._0_4_ = fVar209 * auVar4._0_4_ * fVar221;
            local_980._4_4_ = fVar209 * auVar4._4_4_ * fVar221;
            local_980._8_4_ = fVar209 * auVar4._8_4_ * fVar221;
            local_980._12_4_ = fVar209 * auVar4._12_4_ * fVar221;
            local_9e0._0_4_ = local_840._0_4_ * fVar209;
            local_9e0._4_4_ = local_840._4_4_ * fVar209;
            local_9e0._8_4_ = fVar225 * fVar209;
            local_9e0._12_4_ = fVar245 * fVar209;
            if (fVar223 < -fVar223) {
              local_aa0._0_4_ = auVar114._0_4_;
              local_960._0_16_ = auVar259;
              auVar277 = ZEXT1664(local_840._0_16_);
              fVar209 = sqrtf(fVar223);
              auVar286 = ZEXT464((uint)local_aa0._0_4_);
              auVar259 = local_960._0_16_;
            }
            else {
              auVar114 = vsqrtss_avx(auVar271,auVar271);
              fVar209 = auVar114._0_4_;
            }
            local_aa0._0_16_ = vdpps_avx(_local_940,local_9e0._0_16_,0x7f);
            auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_920),auVar286._0_16_,
                                     ZEXT416((uint)local_900._0_4_));
            auVar114 = vdpps_avx(auVar259,local_9e0._0_16_,0x7f);
            auVar288 = vdpps_avx(_local_940,local_980._0_16_,0x7f);
            auVar271 = vdpps_avx(local_820._0_16_,local_9e0._0_16_,0x7f);
            auVar4 = vfmadd213ss_fma(ZEXT416((uint)(auVar286._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_920 / fVar209)),auVar4);
            local_960._0_4_ = auVar4._0_4_;
            auVar111._0_4_ = local_aa0._0_4_ * local_aa0._0_4_;
            auVar111._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
            auVar111._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
            auVar111._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
            auVar4 = vdpps_avx(_local_940,auVar259,0x7f);
            auVar146 = vsubps_avx(local_b20._0_16_,auVar111);
            auVar141 = vrsqrtss_avx(auVar146,auVar146);
            fVar221 = auVar146._0_4_;
            fVar209 = auVar141._0_4_;
            fVar209 = fVar209 * 1.5 + fVar221 * -0.5 * fVar209 * fVar209 * fVar209;
            auVar141 = vdpps_avx(_local_940,local_820._0_16_,0x7f);
            local_9e0._0_16_ = ZEXT416((uint)(auVar114._0_4_ + auVar288._0_4_));
            local_980._0_16_ = vfnmadd231ss_fma(auVar4,local_aa0._0_16_,local_9e0._0_16_);
            auVar264 = ZEXT1664(local_980._0_16_);
            auVar19 = vfnmadd231ss_fma(auVar141,local_aa0._0_16_,auVar271);
            if (fVar221 < 0.0) {
              local_700._0_16_ = auVar271;
              local_720._0_4_ = fVar209;
              local_740 = auVar19._0_4_;
              fStack_73c = auVar19._4_4_;
              fStack_738 = auVar19._8_4_;
              fStack_734 = auVar19._12_4_;
              auVar264 = ZEXT1664(local_980._0_16_);
              auVar277 = ZEXT1664(auVar277._0_16_);
              auVar286 = ZEXT1664(auVar286._0_16_);
              fVar221 = sqrtf(fVar221);
              auVar19._4_4_ = fStack_73c;
              auVar19._0_4_ = local_740;
              auVar19._8_4_ = fStack_738;
              auVar19._12_4_ = fStack_734;
              fVar209 = (float)local_720._0_4_;
              auVar271 = local_700._0_16_;
            }
            else {
              auVar114 = vsqrtss_avx(auVar146,auVar146);
              fVar221 = auVar114._0_4_;
            }
            auVar288 = vpermilps_avx(local_860._0_16_,0xff);
            auVar4 = vpermilps_avx(local_840._0_16_,0xff);
            auVar114 = vfmsub213ss_fma(local_980._0_16_,ZEXT416((uint)fVar209),auVar4);
            auVar195._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
            auVar195._8_4_ = auVar271._8_4_ ^ 0x80000000;
            auVar195._12_4_ = auVar271._12_4_ ^ 0x80000000;
            auVar213._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
            auVar213._8_4_ = auVar114._8_4_ ^ 0x80000000;
            auVar213._12_4_ = auVar114._12_4_ ^ 0x80000000;
            auVar244 = ZEXT1664(local_9e0._0_16_);
            auVar141 = ZEXT416((uint)(auVar19._0_4_ * fVar209));
            auVar271 = vfmsub231ss_fma(ZEXT416((uint)(auVar271._0_4_ * auVar114._0_4_)),
                                       local_9e0._0_16_,auVar141);
            auVar114 = vinsertps_avx(auVar141,auVar195,0x10);
            uVar101 = auVar271._0_4_;
            auVar196._4_4_ = uVar101;
            auVar196._0_4_ = uVar101;
            auVar196._8_4_ = uVar101;
            auVar196._12_4_ = uVar101;
            auVar114 = vdivps_avx(auVar114,auVar196);
            auVar141 = ZEXT416((uint)(fVar221 - auVar288._0_4_));
            auVar271 = vinsertps_avx(local_aa0._0_16_,auVar141,0x10);
            auVar172._0_4_ = auVar271._0_4_ * auVar114._0_4_;
            auVar172._4_4_ = auVar271._4_4_ * auVar114._4_4_;
            auVar172._8_4_ = auVar271._8_4_ * auVar114._8_4_;
            auVar172._12_4_ = auVar271._12_4_ * auVar114._12_4_;
            auVar114 = vinsertps_avx(auVar213,local_9e0._0_16_,0x1c);
            auVar114 = vdivps_avx(auVar114,auVar196);
            auVar288 = vhaddps_avx(auVar172,auVar172);
            auVar197._0_4_ = auVar271._0_4_ * auVar114._0_4_;
            auVar197._4_4_ = auVar271._4_4_ * auVar114._4_4_;
            auVar197._8_4_ = auVar271._8_4_ * auVar114._8_4_;
            auVar197._12_4_ = auVar271._12_4_ * auVar114._12_4_;
            auVar114 = vhaddps_avx(auVar197,auVar197);
            fVar223 = (float)local_b00._0_4_ - auVar288._0_4_;
            auVar273 = ZEXT464((uint)fVar223);
            fVar221 = (float)local_ae0._0_4_ - auVar114._0_4_;
            local_ae0._0_16_ = ZEXT416((uint)fVar221);
            auVar114 = vandps_avx(local_aa0._0_16_,local_6e0._0_16_);
            bVar68 = true;
            fVar225 = (float)local_8c0._4_4_;
            fVar245 = fStack_8b8;
            fVar257 = fStack_8b4;
            fVar246 = fStack_8b0;
            fVar222 = fStack_8ac;
            fVar247 = fStack_8a8;
            fVar209 = (float)local_8c0._0_4_;
            if ((float)local_960._0_4_ <= auVar114._0_4_) {
              auVar235 = ZEXT3264(_local_a80);
            }
            else {
              auVar288 = vfmadd231ss_fma(ZEXT416((uint)((float)local_960._0_4_ +
                                                       (float)local_900._0_4_)),local_760._0_16_,
                                         ZEXT416(0x36000000));
              auVar114 = vandps_avx(auVar141,local_6e0._0_16_);
              auVar235 = ZEXT3264(_local_a80);
              if (auVar114._0_4_ < auVar288._0_4_) {
                fVar221 = fVar221 + (float)local_7f0._0_4_;
                local_ae0._0_16_ = ZEXT416((uint)fVar221);
                if (((((ray->org).field_0.m128[3] <= fVar221) && (fVar221 <= ray->tfar)) &&
                    (0.0 <= fVar223)) && (fVar223 <= 1.0)) {
                  auVar114 = vrsqrtss_avx(local_b20._0_16_,local_b20._0_16_);
                  fVar137 = auVar114._0_4_;
                  fVar279 = local_b20._0_4_;
                  pGVar9 = (context->scene->geometries).items[local_aa8].ptr;
                  if ((pGVar9->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      local_b20._0_4_ = ray->tfar;
                      fVar209 = fVar137 * 1.5 + fVar279 * -0.5 * fVar137 * fVar137 * fVar137;
                      auVar142._0_4_ = fVar209 * (float)local_940._0_4_;
                      auVar142._4_4_ = fVar209 * (float)local_940._4_4_;
                      auVar142._8_4_ = fVar209 * fStack_938;
                      auVar142._12_4_ = fVar209 * fStack_934;
                      auVar4 = vfmadd213ps_fma(auVar4,auVar142,local_840._0_16_);
                      auVar114 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar288 = vshufps_avx(local_840._0_16_,local_840._0_16_,0xc9);
                      auVar143._0_4_ = auVar142._0_4_ * auVar288._0_4_;
                      auVar143._4_4_ = auVar142._4_4_ * auVar288._4_4_;
                      auVar143._8_4_ = auVar142._8_4_ * auVar288._8_4_;
                      auVar143._12_4_ = auVar142._12_4_ * auVar288._12_4_;
                      auVar271 = vfmsub231ps_fma(auVar143,local_840._0_16_,auVar114);
                      auVar114 = vshufps_avx(auVar271,auVar271,0xc9);
                      auVar288 = vshufps_avx(auVar4,auVar4,0xc9);
                      auVar271 = vshufps_avx(auVar271,auVar271,0xd2);
                      auVar112._0_4_ = auVar4._0_4_ * auVar271._0_4_;
                      auVar112._4_4_ = auVar4._4_4_ * auVar271._4_4_;
                      auVar112._8_4_ = auVar4._8_4_ * auVar271._8_4_;
                      auVar112._12_4_ = auVar4._12_4_ * auVar271._12_4_;
                      auVar288 = vfmsub231ps_fma(auVar112,auVar114,auVar288);
                      auVar114 = vshufps_avx(auVar288,auVar288,0xe9);
                      local_9c0 = vmovlps_avx(auVar114);
                      local_9b8 = auVar288._0_4_;
                      local_9b0 = 0;
                      local_9ac = (undefined4)local_988;
                      local_9a8 = (undefined4)local_aa8;
                      local_9a4 = context->user->instID[0];
                      local_9a0 = context->user->instPrimID[0];
                      ray->tfar = fVar221;
                      local_b24 = -1;
                      local_a10.valid = &local_b24;
                      local_a10.geometryUserPtr = pGVar9->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = (RTCHitN *)&local_9c0;
                      local_a10.N = 1;
                      local_b00._0_16_ = ZEXT416((uint)fVar223);
                      local_a10.ray = (RTCRayN *)ray;
                      local_9b4 = fVar223;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01952048:
                        p_Var13 = context->args->filter;
                        fVar221 = (float)local_b20._0_4_;
                        fVar209 = (float)local_8c0._0_4_;
                        fVar225 = (float)local_8c0._4_4_;
                        fVar245 = fStack_8b8;
                        fVar257 = fStack_8b4;
                        fVar246 = fStack_8b0;
                        fVar222 = fStack_8ac;
                        fVar247 = fStack_8a8;
                        if (p_Var13 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            auVar244 = ZEXT1664(auVar244._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            auVar277 = ZEXT1664(auVar277._0_16_);
                            auVar286 = ZEXT1664(auVar286._0_16_);
                            (*p_Var13)(&local_a10);
                            auVar273 = ZEXT1664(local_b00._0_16_);
                            auVar235 = ZEXT3264(_local_a80);
                            fVar209 = (float)local_8c0._0_4_;
                            fVar225 = (float)local_8c0._4_4_;
                            fVar245 = fStack_8b8;
                            fVar257 = fStack_8b4;
                            fVar246 = fStack_8b0;
                            fVar222 = fStack_8ac;
                            fVar247 = fStack_8a8;
                          }
                          fVar221 = (float)local_b20._0_4_;
                          if (*local_a10.valid == 0) {
                            unaff_R14B = 0;
                            goto LAB_019520c9;
                          }
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar244 = ZEXT1664(local_9e0._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar277 = ZEXT1664(auVar277._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        (*pGVar9->occlusionFilterN)(&local_a10);
                        auVar273 = ZEXT1664(local_b00._0_16_);
                        auVar235 = ZEXT3264(_local_a80);
                        if (*local_a10.valid != 0) goto LAB_01952048;
                        unaff_R14B = 0;
                        fVar221 = (float)local_b20._0_4_;
                        fVar209 = (float)local_8c0._0_4_;
                        fVar225 = (float)local_8c0._4_4_;
                        fVar245 = fStack_8b8;
                        fVar257 = fStack_8b4;
                        fVar246 = fStack_8b0;
                        fVar222 = fStack_8ac;
                        fVar247 = fStack_8a8;
                      }
LAB_019520c9:
                      if (unaff_R14B == 0) {
                        ray->tfar = fVar221;
                      }
                    }
                    bVar68 = false;
                    goto LAB_01951ec1;
                  }
                }
                bVar68 = false;
                unaff_R14B = 0;
              }
            }
LAB_01951ec1:
            if (!bVar68) goto LAB_019520e0;
            lVar99 = lVar99 + -1;
          } while (lVar99 != 0);
          unaff_R14B = 0;
LAB_019520e0:
          unaff_R14B = unaff_R14B & 1;
          bVar98 = bVar98 | unaff_R14B;
          fVar221 = ray->tfar;
          auVar126._4_4_ = fVar221;
          auVar126._0_4_ = fVar221;
          auVar126._8_4_ = fVar221;
          auVar126._12_4_ = fVar221;
          auVar126._16_4_ = fVar221;
          auVar126._20_4_ = fVar221;
          auVar126._24_4_ = fVar221;
          auVar126._28_4_ = fVar221;
          auVar233 = vcmpps_avx(_local_7a0,auVar126,2);
          auVar125 = vandps_avx(auVar233,local_5c0);
          auVar220 = ZEXT3264(auVar125);
          auVar233 = local_5c0 & auVar233;
          uVar102 = local_780;
          auVar290 = local_8a0;
          auVar291 = local_880;
          local_5c0 = auVar125;
        } while ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar233 >> 0x7f,0) != '\0') ||
                   (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar233 >> 0xbf,0) != '\0') ||
                 (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar233[0x1f] < '\0');
      }
      auVar130._0_4_ = fVar209 * (float)local_6a0._0_4_;
      auVar130._4_4_ = fVar225 * (float)local_6a0._4_4_;
      auVar130._8_4_ = fVar245 * fStack_698;
      auVar130._12_4_ = fVar257 * fStack_694;
      auVar130._16_4_ = fVar246 * fStack_690;
      auVar130._20_4_ = fVar222 * fStack_68c;
      auVar130._28_36_ = auVar220._28_36_;
      auVar130._24_4_ = fVar247 * fStack_688;
      auVar114 = vfmadd213ps_fma(local_680,auVar290,auVar130._0_32_);
      auVar114 = vfmadd213ps_fma(local_660,auVar291,ZEXT1632(auVar114));
      auVar125 = vandps_avx(ZEXT1632(auVar114),local_7c0);
      auVar161._8_4_ = 0x3e99999a;
      auVar161._0_8_ = 0x3e99999a3e99999a;
      auVar161._12_4_ = 0x3e99999a;
      auVar161._16_4_ = 0x3e99999a;
      auVar161._20_4_ = 0x3e99999a;
      auVar161._24_4_ = 0x3e99999a;
      auVar161._28_4_ = 0x3e99999a;
      auVar125 = vcmpps_avx(auVar125,auVar161,1);
      auVar233 = vorps_avx(auVar125,local_300);
      auVar162._0_4_ = auVar235._0_4_ + (float)local_2c0._0_4_;
      auVar162._4_4_ = auVar235._4_4_ + (float)local_2c0._4_4_;
      auVar162._8_4_ = auVar235._8_4_ + fStack_2b8;
      auVar162._12_4_ = auVar235._12_4_ + fStack_2b4;
      auVar162._16_4_ = auVar235._16_4_ + fStack_2b0;
      auVar162._20_4_ = auVar235._20_4_ + fStack_2ac;
      auVar162._24_4_ = auVar235._24_4_ + fStack_2a8;
      auVar162._28_4_ = auVar235._28_4_ + fStack_2a4;
      fVar209 = ray->tfar;
      auVar185._4_4_ = fVar209;
      auVar185._0_4_ = fVar209;
      auVar185._8_4_ = fVar209;
      auVar185._12_4_ = fVar209;
      auVar185._16_4_ = fVar209;
      auVar185._20_4_ = fVar209;
      auVar185._24_4_ = fVar209;
      auVar185._28_4_ = fVar209;
      auVar125 = vcmpps_avx(auVar162,auVar185,2);
      local_760 = vandps_avx(auVar125,local_2e0);
      auVar163._8_4_ = 3;
      auVar163._0_8_ = 0x300000003;
      auVar163._12_4_ = 3;
      auVar163._16_4_ = 3;
      auVar163._20_4_ = 3;
      auVar163._24_4_ = 3;
      auVar163._28_4_ = 3;
      auVar186._8_4_ = 2;
      auVar186._0_8_ = 0x200000002;
      auVar186._12_4_ = 2;
      auVar186._16_4_ = 2;
      auVar186._20_4_ = 2;
      auVar186._24_4_ = 2;
      auVar186._28_4_ = 2;
      auVar125 = vblendvps_avx(auVar186,auVar163,auVar233);
      _local_7a0 = vpcmpgtd_avx2(auVar125,local_320);
      auVar125 = vpandn_avx2(_local_7a0,local_760);
      auVar233 = local_760 & ~_local_7a0;
      if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar233 >> 0x7f,0) != '\0') ||
            (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar233 >> 0xbf,0) != '\0') ||
          (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar233[0x1f] < '\0') {
        auVar288 = vminps_avx(local_a20,local_a40);
        auVar114 = vmaxps_avx(local_a20,local_a40);
        auVar271 = vminps_avx(local_a30,_local_a50);
        auVar4 = vminps_avx(auVar288,auVar271);
        auVar288 = vmaxps_avx(local_a30,_local_a50);
        auVar271 = vmaxps_avx(auVar114,auVar288);
        local_880._8_4_ = 0x7fffffff;
        local_880._0_8_ = 0x7fffffff7fffffff;
        local_880._12_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar4,local_880._0_16_);
        auVar288 = vandps_avx(auVar271,local_880._0_16_);
        auVar114 = vmaxps_avx(auVar114,auVar288);
        auVar288 = vmovshdup_avx(auVar114);
        auVar288 = vmaxss_avx(auVar288,auVar114);
        auVar114 = vshufpd_avx(auVar114,auVar114,1);
        auVar114 = vmaxss_avx(auVar114,auVar288);
        local_820._0_4_ = auVar114._0_4_ * 1.9073486e-06;
        local_700._0_16_ = vshufps_avx(auVar271,auVar271,0xff);
        local_720 = _local_520;
        local_740 = auVar235._0_4_ + (float)local_520._0_4_;
        fStack_73c = auVar235._4_4_ + (float)local_520._4_4_;
        fStack_738 = auVar235._8_4_ + fStack_518;
        fStack_734 = auVar235._12_4_ + fStack_514;
        fStack_730 = auVar235._16_4_ + fStack_510;
        fStack_72c = auVar235._20_4_ + fStack_50c;
        fStack_728 = auVar235._24_4_ + fStack_508;
        fStack_724 = auVar235._28_4_ + fStack_504;
        do {
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar233 = vblendvps_avx(auVar164,local_720,auVar125);
          auVar291 = vshufps_avx(auVar233,auVar233,0xb1);
          auVar291 = vminps_avx(auVar233,auVar291);
          auVar14 = vshufpd_avx(auVar291,auVar291,5);
          auVar291 = vminps_avx(auVar291,auVar14);
          auVar14 = vpermpd_avx2(auVar291,0x4e);
          auVar291 = vminps_avx(auVar291,auVar14);
          auVar291 = vcmpps_avx(auVar233,auVar291,0);
          auVar14 = auVar125 & auVar291;
          auVar233 = auVar125;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar233 = vandps_avx(auVar291,auVar125);
          }
          uVar96 = vmovmskps_avx(auVar233);
          iVar18 = 0;
          for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          uVar96 = iVar18 << 2;
          local_5e0 = auVar125;
          *(undefined4 *)(local_5e0 + uVar96) = 0;
          aVar2 = (ray->dir).field_0;
          local_900._0_16_ = (undefined1  [16])aVar2;
          auVar114 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          auVar273 = ZEXT464(*(uint *)(local_560 + uVar96));
          auVar277 = ZEXT464(*(uint *)(local_500 + uVar96));
          if (auVar114._0_4_ < 0.0) {
            local_ae0._0_16_ = ZEXT416(*(uint *)(local_560 + uVar96));
            local_b00._0_16_ = ZEXT416(*(uint *)(local_500 + uVar96));
            fVar209 = sqrtf(auVar114._0_4_);
            auVar277 = ZEXT1664(local_b00._0_16_);
            auVar273 = ZEXT1664(local_ae0._0_16_);
          }
          else {
            auVar114 = vsqrtss_avx(auVar114,auVar114);
            fVar209 = auVar114._0_4_;
          }
          local_6c0._0_4_ = fVar209 * 1.9073486e-06;
          lVar99 = 5;
          do {
            fVar221 = auVar273._0_4_;
            fVar257 = 1.0 - fVar221;
            _local_940 = ZEXT416((uint)fVar257);
            fVar225 = fVar257 * fVar257 * fVar257;
            fVar245 = fVar221 * fVar221;
            fVar223 = fVar221 * fVar245;
            auVar288 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                       ZEXT416((uint)fVar223));
            fVar209 = fVar221 * fVar257;
            auVar271 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar209 * 6.0)),
                                       ZEXT416((uint)(fVar257 * fVar209)),
                                       SUB6416(ZEXT464(0x41400000),0));
            auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar209 * 6.0)),
                                     SUB6416(ZEXT464(0x41400000),0),
                                     ZEXT416((uint)(fVar221 * fVar209)));
            auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar223),
                                       ZEXT416((uint)fVar225));
            fVar221 = (auVar114._0_4_ + auVar4._0_4_) * 0.16666667;
            fVar223 = fVar223 * 0.16666667;
            auVar144._0_4_ = fVar223 * (float)local_a50._0_4_;
            auVar144._4_4_ = fVar223 * (float)local_a50._4_4_;
            auVar144._8_4_ = fVar223 * fStack_a48;
            auVar144._12_4_ = fVar223 * fStack_a44;
            auVar198._4_4_ = fVar221;
            auVar198._0_4_ = fVar221;
            auVar198._8_4_ = fVar221;
            auVar198._12_4_ = fVar221;
            auVar114 = vfmadd132ps_fma(auVar198,auVar144,local_a30);
            fVar221 = (auVar288._0_4_ + auVar271._0_4_) * 0.16666667;
            auVar145._4_4_ = fVar221;
            auVar145._0_4_ = fVar221;
            auVar145._8_4_ = fVar221;
            auVar145._12_4_ = fVar221;
            auVar114 = vfmadd132ps_fma(auVar145,auVar114,local_a40);
            uVar101 = auVar277._0_4_;
            auVar173._4_4_ = uVar101;
            auVar173._0_4_ = uVar101;
            auVar173._8_4_ = uVar101;
            auVar173._12_4_ = uVar101;
            auVar288 = vfmadd213ps_fma(auVar173,local_900._0_16_,_DAT_01feba10);
            fVar225 = fVar225 * 0.16666667;
            auVar113._4_4_ = fVar225;
            auVar113._0_4_ = fVar225;
            auVar113._8_4_ = fVar225;
            auVar113._12_4_ = fVar225;
            auVar114 = vfmadd132ps_fma(auVar113,auVar114,local_a20);
            local_840._0_16_ = auVar114;
            auVar114 = vsubps_avx(auVar288,auVar114);
            _local_920 = auVar114;
            auVar114 = vdpps_avx(auVar114,auVar114,0x7f);
            local_ae0._0_16_ = auVar273._0_16_;
            local_b00._0_16_ = auVar277._0_16_;
            local_b20._0_16_ = auVar114;
            if (auVar114._0_4_ < 0.0) {
              _local_940 = ZEXT416((uint)fVar257);
              local_860._0_4_ = fVar245;
              local_aa0._0_4_ = fVar209;
              auVar244._0_4_ = sqrtf(auVar114._0_4_);
              auVar244._4_60_ = extraout_var_00;
              auVar114 = auVar244._0_16_;
              fVar245 = (float)local_860._0_4_;
              fVar209 = (float)local_aa0._0_4_;
              auVar288 = local_ae0._0_16_;
              auVar271 = local_b00._0_16_;
            }
            else {
              auVar114 = vsqrtss_avx(auVar114,auVar114);
              auVar288 = auVar273._0_16_;
              auVar271 = auVar277._0_16_;
            }
            auVar286 = ZEXT1664(auVar114);
            fVar221 = local_940._0_4_;
            auVar115._4_4_ = fVar221;
            auVar115._0_4_ = fVar221;
            auVar115._8_4_ = fVar221;
            auVar115._12_4_ = fVar221;
            auVar141 = vfnmsub213ss_fma(auVar288,auVar288,ZEXT416((uint)(fVar209 * 4.0)));
            auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * 4.0)),_local_940,_local_940);
            fVar209 = fVar221 * -fVar221 * 0.5;
            fVar221 = auVar141._0_4_ * 0.5;
            fVar223 = auVar4._0_4_ * 0.5;
            fVar245 = fVar245 * 0.5;
            auVar230._0_4_ = (float)local_a50._0_4_ * fVar245;
            auVar230._4_4_ = (float)local_a50._4_4_ * fVar245;
            auVar230._8_4_ = fStack_a48 * fVar245;
            auVar230._12_4_ = fStack_a44 * fVar245;
            auVar199._4_4_ = fVar223;
            auVar199._0_4_ = fVar223;
            auVar199._8_4_ = fVar223;
            auVar199._12_4_ = fVar223;
            auVar4 = vfmadd213ps_fma(auVar199,local_a30,auVar230);
            auVar214._4_4_ = fVar221;
            auVar214._0_4_ = fVar221;
            auVar214._8_4_ = fVar221;
            auVar214._12_4_ = fVar221;
            auVar4 = vfmadd213ps_fma(auVar214,local_a40,auVar4);
            auVar260._4_4_ = fVar209;
            auVar260._0_4_ = fVar209;
            auVar260._8_4_ = fVar209;
            auVar260._12_4_ = fVar209;
            auVar146 = vfmadd213ps_fma(auVar260,local_a20,auVar4);
            auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_940,auVar288);
            auVar141 = vfmadd231ss_fma(_local_940,auVar288,SUB6416(ZEXT464(0xc0000000),0));
            fVar209 = auVar288._0_4_;
            auVar200._0_4_ = (float)local_a50._0_4_ * fVar209;
            auVar200._4_4_ = (float)local_a50._4_4_ * fVar209;
            auVar200._8_4_ = fStack_a48 * fVar209;
            auVar200._12_4_ = fStack_a44 * fVar209;
            uVar101 = auVar141._0_4_;
            auVar215._4_4_ = uVar101;
            auVar215._0_4_ = uVar101;
            auVar215._8_4_ = uVar101;
            auVar215._12_4_ = uVar101;
            auVar288 = vfmadd213ps_fma(auVar215,local_a30,auVar200);
            auVar174._0_4_ = auVar4._0_4_;
            auVar174._4_4_ = auVar174._0_4_;
            auVar174._8_4_ = auVar174._0_4_;
            auVar174._12_4_ = auVar174._0_4_;
            auVar288 = vfmadd213ps_fma(auVar174,local_a40,auVar288);
            auVar5 = vfmadd231ps_fma(auVar288,local_a20,auVar115);
            auVar4 = vdpps_avx(auVar146,auVar146,0x7f);
            auVar288 = vblendps_avx(auVar4,_DAT_01feba10,0xe);
            auVar141 = vrsqrtss_avx(auVar288,auVar288);
            fVar209 = auVar141._0_4_;
            fVar223 = auVar4._0_4_;
            fVar209 = fVar209 * 1.5 + fVar223 * -0.5 * fVar209 * fVar209 * fVar209;
            auVar141 = vdpps_avx(auVar146,auVar5,0x7f);
            auVar175._0_4_ = auVar5._0_4_ * fVar223;
            auVar175._4_4_ = auVar5._4_4_ * fVar223;
            auVar175._8_4_ = auVar5._8_4_ * fVar223;
            auVar175._12_4_ = auVar5._12_4_ * fVar223;
            fVar221 = auVar141._0_4_;
            auVar231._0_4_ = auVar146._0_4_ * fVar221;
            auVar231._4_4_ = auVar146._4_4_ * fVar221;
            fVar225 = auVar146._8_4_;
            auVar231._8_4_ = fVar225 * fVar221;
            fVar245 = auVar146._12_4_;
            auVar231._12_4_ = fVar245 * fVar221;
            auVar141 = vsubps_avx(auVar175,auVar231);
            auVar288 = vrcpss_avx(auVar288,auVar288);
            auVar5 = vfnmadd213ss_fma(auVar288,auVar4,ZEXT416(0x40000000));
            fVar221 = auVar288._0_4_ * auVar5._0_4_;
            auVar288 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                  ZEXT416((uint)(auVar271._0_4_ * (float)local_6c0._0_4_)));
            auVar272._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
            auVar272._8_4_ = -fVar225;
            auVar272._12_4_ = -fVar245;
            local_980._0_4_ = fVar209 * auVar141._0_4_ * fVar221;
            local_980._4_4_ = fVar209 * auVar141._4_4_ * fVar221;
            local_980._8_4_ = fVar209 * auVar141._8_4_ * fVar221;
            local_980._12_4_ = fVar209 * auVar141._12_4_ * fVar221;
            local_9e0._0_4_ = auVar146._0_4_ * fVar209;
            local_9e0._4_4_ = auVar146._4_4_ * fVar209;
            local_9e0._8_4_ = fVar225 * fVar209;
            local_9e0._12_4_ = fVar245 * fVar209;
            _local_940 = auVar146;
            local_860._0_4_ = auVar288._0_4_;
            if (fVar223 < -fVar223) {
              local_aa0._0_4_ = auVar114._0_4_;
              local_960._0_16_ = auVar272;
              fVar209 = sqrtf(fVar223);
              auVar288 = ZEXT416((uint)local_860._0_4_);
              auVar286 = ZEXT464((uint)local_aa0._0_4_);
              auVar272 = local_960._0_16_;
            }
            else {
              auVar114 = vsqrtss_avx(auVar4,auVar4);
              fVar209 = auVar114._0_4_;
            }
            local_aa0._0_16_ = vdpps_avx(_local_920,local_9e0._0_16_,0x7f);
            auVar141 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar286._0_16_,auVar288);
            auVar114 = vdpps_avx(auVar272,local_9e0._0_16_,0x7f);
            auVar271 = vdpps_avx(_local_920,local_980._0_16_,0x7f);
            auVar4 = vdpps_avx(local_900._0_16_,local_9e0._0_16_,0x7f);
            auVar141 = vfmadd213ss_fma(ZEXT416((uint)(auVar286._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_820._0_4_ / fVar209)),auVar141);
            local_960._0_4_ = auVar141._0_4_;
            auVar116._0_4_ = local_aa0._0_4_ * local_aa0._0_4_;
            auVar116._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
            auVar116._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
            auVar116._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
            auVar141 = vdpps_avx(_local_920,auVar272,0x7f);
            auVar5 = vsubps_avx(local_b20._0_16_,auVar116);
            auVar146 = vrsqrtss_avx(auVar5,auVar5);
            fVar221 = auVar5._0_4_;
            fVar209 = auVar146._0_4_;
            fVar209 = fVar209 * 1.5 + fVar221 * -0.5 * fVar209 * fVar209 * fVar209;
            auVar146 = vdpps_avx(_local_920,local_900._0_16_,0x7f);
            local_9e0._0_16_ = ZEXT416((uint)(auVar114._0_4_ + auVar271._0_4_));
            local_980._0_16_ = vfnmadd231ss_fma(auVar141,local_aa0._0_16_,local_9e0._0_16_);
            auVar114 = vfnmadd231ss_fma(auVar146,local_aa0._0_16_,auVar4);
            if (fVar221 < 0.0) {
              local_8a0._0_16_ = auVar4;
              local_8c0._0_4_ = fVar209;
              local_6e0._0_16_ = auVar114;
              auVar286 = ZEXT1664(auVar286._0_16_);
              fVar221 = sqrtf(fVar221);
              auVar288 = ZEXT416((uint)local_860._0_4_);
              fVar209 = (float)local_8c0._0_4_;
              auVar114 = local_6e0._0_16_;
              auVar4 = local_8a0._0_16_;
            }
            else {
              auVar271 = vsqrtss_avx(auVar5,auVar5);
              fVar221 = auVar271._0_4_;
            }
            auVar271 = vpermilps_avx(local_840._0_16_,0xff);
            auVar141 = vshufps_avx(_local_940,_local_940,0xff);
            auVar146 = vfmsub213ss_fma(local_980._0_16_,ZEXT416((uint)fVar209),auVar141);
            auVar201._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
            auVar201._8_4_ = auVar4._8_4_ ^ 0x80000000;
            auVar201._12_4_ = auVar4._12_4_ ^ 0x80000000;
            auVar216._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
            auVar216._8_4_ = auVar146._8_4_ ^ 0x80000000;
            auVar216._12_4_ = auVar146._12_4_ ^ 0x80000000;
            auVar264 = ZEXT1664(local_9e0._0_16_);
            auVar114 = ZEXT416((uint)(auVar114._0_4_ * fVar209));
            auVar4 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar146._0_4_)),local_9e0._0_16_
                                     ,auVar114);
            auVar114 = vinsertps_avx(auVar114,auVar201,0x10);
            uVar101 = auVar4._0_4_;
            auVar202._4_4_ = uVar101;
            auVar202._0_4_ = uVar101;
            auVar202._8_4_ = uVar101;
            auVar202._12_4_ = uVar101;
            auVar114 = vdivps_avx(auVar114,auVar202);
            auVar244 = ZEXT1664(local_aa0._0_16_);
            auVar146 = ZEXT416((uint)(fVar221 - auVar271._0_4_));
            auVar4 = vinsertps_avx(local_aa0._0_16_,auVar146,0x10);
            auVar176._0_4_ = auVar4._0_4_ * auVar114._0_4_;
            auVar176._4_4_ = auVar4._4_4_ * auVar114._4_4_;
            auVar176._8_4_ = auVar4._8_4_ * auVar114._8_4_;
            auVar176._12_4_ = auVar4._12_4_ * auVar114._12_4_;
            auVar114 = vinsertps_avx(auVar216,local_9e0._0_16_,0x1c);
            auVar114 = vdivps_avx(auVar114,auVar202);
            auVar271 = vhaddps_avx(auVar176,auVar176);
            auVar203._0_4_ = auVar4._0_4_ * auVar114._0_4_;
            auVar203._4_4_ = auVar4._4_4_ * auVar114._4_4_;
            auVar203._8_4_ = auVar4._8_4_ * auVar114._8_4_;
            auVar203._12_4_ = auVar4._12_4_ * auVar114._12_4_;
            auVar114 = vhaddps_avx(auVar203,auVar203);
            fVar221 = (float)local_ae0._0_4_ - auVar271._0_4_;
            auVar273 = ZEXT464((uint)fVar221);
            fVar209 = (float)local_b00._0_4_ - auVar114._0_4_;
            auVar277 = ZEXT464((uint)fVar209);
            auVar114 = vandps_avx(local_aa0._0_16_,local_880._0_16_);
            bVar68 = true;
            if ((float)local_960._0_4_ <= auVar114._0_4_) {
              auVar235 = ZEXT3264(_local_a80);
            }
            else {
              auVar288 = vfmadd231ss_fma(ZEXT416((uint)(auVar288._0_4_ + (float)local_960._0_4_)),
                                         local_700._0_16_,ZEXT416(0x36000000));
              auVar114 = vandps_avx(auVar146,local_880._0_16_);
              auVar235 = ZEXT3264(_local_a80);
              if (auVar114._0_4_ < auVar288._0_4_) {
                fVar209 = fVar209 + (float)local_7f0._0_4_;
                auVar277 = ZEXT464((uint)fVar209);
                if (((((ray->org).field_0.m128[3] <= fVar209) &&
                     (fVar223 = ray->tfar, fVar209 <= fVar223)) && (0.0 <= fVar221)) &&
                   (fVar221 <= 1.0)) {
                  auVar114 = vrsqrtss_avx(local_b20._0_16_,local_b20._0_16_);
                  fVar225 = auVar114._0_4_;
                  pGVar9 = (context->scene->geometries).items[local_aa8].ptr;
                  if ((pGVar9->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      fVar225 = fVar225 * 1.5 + local_b20._0_4_ * -0.5 * fVar225 * fVar225 * fVar225
                      ;
                      auVar147._0_4_ = fVar225 * (float)local_920;
                      auVar147._4_4_ = fVar225 * (float)auStack_91c._0_4_;
                      auVar147._8_4_ = fVar225 * (float)auStack_91c._4_4_;
                      auVar147._12_4_ = fVar225 * fStack_914;
                      auVar4 = vfmadd213ps_fma(auVar141,auVar147,_local_940);
                      auVar114 = vshufps_avx(auVar147,auVar147,0xc9);
                      auVar288 = vshufps_avx(_local_940,_local_940,0xc9);
                      auVar148._0_4_ = auVar147._0_4_ * auVar288._0_4_;
                      auVar148._4_4_ = auVar147._4_4_ * auVar288._4_4_;
                      auVar148._8_4_ = auVar147._8_4_ * auVar288._8_4_;
                      auVar148._12_4_ = auVar147._12_4_ * auVar288._12_4_;
                      auVar271 = vfmsub231ps_fma(auVar148,_local_940,auVar114);
                      auVar114 = vshufps_avx(auVar271,auVar271,0xc9);
                      auVar288 = vshufps_avx(auVar4,auVar4,0xc9);
                      auVar271 = vshufps_avx(auVar271,auVar271,0xd2);
                      auVar117._0_4_ = auVar4._0_4_ * auVar271._0_4_;
                      auVar117._4_4_ = auVar4._4_4_ * auVar271._4_4_;
                      auVar117._8_4_ = auVar4._8_4_ * auVar271._8_4_;
                      auVar117._12_4_ = auVar4._12_4_ * auVar271._12_4_;
                      auVar288 = vfmsub231ps_fma(auVar117,auVar114,auVar288);
                      auVar114 = vshufps_avx(auVar288,auVar288,0xe9);
                      local_9c0 = vmovlps_avx(auVar114);
                      local_9b8 = auVar288._0_4_;
                      local_9b0 = 0;
                      local_9ac = (undefined4)local_988;
                      local_9a8 = (undefined4)local_aa8;
                      local_9a4 = context->user->instID[0];
                      local_9a0 = context->user->instPrimID[0];
                      ray->tfar = fVar209;
                      local_b24 = -1;
                      local_a10.valid = &local_b24;
                      local_a10.geometryUserPtr = pGVar9->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = (RTCHitN *)&local_9c0;
                      local_a10.N = 1;
                      local_ae0._0_16_ = ZEXT416((uint)fVar221);
                      local_b00._0_16_ = ZEXT416((uint)fVar209);
                      local_b20._0_4_ = fVar223;
                      local_a10.ray = (RTCRayN *)ray;
                      local_9b4 = fVar221;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01952a93:
                        p_Var13 = context->args->filter;
                        if (p_Var13 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            auVar244 = ZEXT1664(auVar244._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            auVar286 = ZEXT1664(auVar286._0_16_);
                            (*p_Var13)(&local_a10);
                            auVar277 = ZEXT1664(local_b00._0_16_);
                            auVar273 = ZEXT1664(local_ae0._0_16_);
                            auVar235 = ZEXT3264(_local_a80);
                            fVar223 = (float)local_b20._0_4_;
                          }
                          if (*local_a10.valid == 0) goto LAB_01952aeb;
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar244 = ZEXT1664(local_aa0._0_16_);
                        auVar264 = ZEXT1664(local_9e0._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        (*pGVar9->occlusionFilterN)(&local_a10);
                        auVar277 = ZEXT1664(local_b00._0_16_);
                        auVar273 = ZEXT1664(local_ae0._0_16_);
                        auVar235 = ZEXT3264(_local_a80);
                        fVar223 = (float)local_b20._0_4_;
                        if (*local_a10.valid != 0) goto LAB_01952a93;
LAB_01952aeb:
                        unaff_R14B = 0;
                      }
                      if (unaff_R14B == 0) {
                        ray->tfar = fVar223;
                      }
                    }
                    bVar68 = false;
                    goto LAB_01952923;
                  }
                }
                bVar68 = false;
                unaff_R14B = 0;
              }
            }
LAB_01952923:
            if (!bVar68) goto LAB_01952b05;
            lVar99 = lVar99 + -1;
          } while (lVar99 != 0);
          unaff_R14B = 0;
LAB_01952b05:
          unaff_R14B = unaff_R14B & 1;
          bVar98 = bVar98 | unaff_R14B;
          fVar209 = ray->tfar;
          auVar127._4_4_ = fVar209;
          auVar127._0_4_ = fVar209;
          auVar127._8_4_ = fVar209;
          auVar127._12_4_ = fVar209;
          auVar127._16_4_ = fVar209;
          auVar127._20_4_ = fVar209;
          auVar127._24_4_ = fVar209;
          auVar127._28_4_ = fVar209;
          auVar77._4_4_ = fStack_73c;
          auVar77._0_4_ = local_740;
          auVar77._8_4_ = fStack_738;
          auVar77._12_4_ = fStack_734;
          auVar77._16_4_ = fStack_730;
          auVar77._20_4_ = fStack_72c;
          auVar77._24_4_ = fStack_728;
          auVar77._28_4_ = fStack_724;
          auVar233 = vcmpps_avx(auVar77,auVar127,2);
          auVar125 = vandps_avx(auVar233,local_5e0);
          local_5e0 = local_5e0 & auVar233;
          uVar102 = local_780;
        } while ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_5e0 >> 0x7f,0) != '\0') ||
                   (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_5e0 >> 0xbf,0) != '\0') ||
                 (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_5e0[0x1f] < '\0');
      }
      auVar165._0_4_ = auVar235._0_4_ + local_4e0._0_4_;
      auVar165._4_4_ = auVar235._4_4_ + local_4e0._4_4_;
      auVar165._8_4_ = auVar235._8_4_ + local_4e0._8_4_;
      auVar165._12_4_ = auVar235._12_4_ + local_4e0._12_4_;
      auVar165._16_4_ = auVar235._16_4_ + local_4e0._16_4_;
      auVar165._20_4_ = auVar235._20_4_ + local_4e0._20_4_;
      auVar165._24_4_ = auVar235._24_4_ + local_4e0._24_4_;
      auVar165._28_4_ = auVar235._28_4_ + local_4e0._28_4_;
      fVar209 = ray->tfar;
      auVar208._4_4_ = fVar209;
      auVar208._0_4_ = fVar209;
      auVar208._8_4_ = fVar209;
      auVar208._12_4_ = fVar209;
      auVar208._16_4_ = fVar209;
      auVar208._20_4_ = fVar209;
      auVar208._24_4_ = fVar209;
      auVar208._28_4_ = fVar209;
      auVar233 = vcmpps_avx(auVar165,auVar208,2);
      auVar125 = vandps_avx(local_2a0,local_5a0);
      auVar125 = vandps_avx(auVar233,auVar125);
      auVar218._0_4_ = auVar235._0_4_ + local_520._0_4_;
      auVar218._4_4_ = auVar235._4_4_ + local_520._4_4_;
      auVar218._8_4_ = auVar235._8_4_ + local_520._8_4_;
      auVar218._12_4_ = auVar235._12_4_ + local_520._12_4_;
      auVar218._16_4_ = auVar235._16_4_ + local_520._16_4_;
      auVar218._20_4_ = auVar235._20_4_ + local_520._20_4_;
      auVar218._24_4_ = auVar235._24_4_ + local_520._24_4_;
      auVar218._28_4_ = auVar235._28_4_ + local_520._28_4_;
      auVar291 = vcmpps_avx(auVar218,auVar208,2);
      auVar233 = vandps_avx(_local_7a0,local_760);
      auVar233 = vandps_avx(auVar291,auVar233);
      auVar233 = vorps_avx(auVar125,auVar233);
      if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar233 >> 0x7f,0) != '\0') ||
            (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar233 >> 0xbf,0) != '\0') ||
          (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar233[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar233;
        auVar125 = vblendvps_avx(_local_520,local_4e0,auVar125);
        *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar125;
        uVar105 = vmovlps_avx(local_7e0);
        *(undefined8 *)(afStack_140 + uVar97 * 0x18) = uVar105;
        auStack_138[uVar97 * 0x18] = (int)uVar102 + 1;
        uVar97 = (ulong)((int)uVar97 + 1);
      }
    }
    fVar209 = ray->tfar;
    auVar124._4_4_ = fVar209;
    auVar124._0_4_ = fVar209;
    auVar124._8_4_ = fVar209;
    auVar124._12_4_ = fVar209;
    auVar124._16_4_ = fVar209;
    auVar124._20_4_ = fVar209;
    auVar124._24_4_ = fVar209;
    auVar124._28_4_ = fVar209;
    uVar103 = uVar97;
    do {
      if ((int)uVar103 == 0) {
        if (bVar98 != 0) {
          return local_b31;
        }
        fVar209 = ray->tfar;
        auVar129._4_4_ = fVar209;
        auVar129._0_4_ = fVar209;
        auVar129._8_4_ = fVar209;
        auVar129._12_4_ = fVar209;
        auVar129._16_4_ = fVar209;
        auVar129._20_4_ = fVar209;
        auVar129._24_4_ = fVar209;
        auVar129._28_4_ = fVar209;
        auVar125 = vcmpps_avx(local_280,auVar129,2);
        uVar96 = vmovmskps_avx(auVar125);
        uVar96 = uVar96 & (uint)local_7c8 - 1 & (uint)local_7c8;
        local_b31 = uVar96 != 0;
        if (!local_b31) {
          return local_b31;
        }
        goto LAB_01950607;
      }
      uVar97 = (ulong)((int)uVar103 - 1);
      lVar99 = uVar97 * 0x60;
      auVar125 = *(undefined1 (*) [32])(auStack_160 + lVar99);
      auVar156._0_4_ = auVar235._0_4_ + auVar125._0_4_;
      auVar156._4_4_ = auVar235._4_4_ + auVar125._4_4_;
      auVar156._8_4_ = auVar235._8_4_ + auVar125._8_4_;
      auVar156._12_4_ = auVar235._12_4_ + auVar125._12_4_;
      auVar156._16_4_ = auVar235._16_4_ + auVar125._16_4_;
      auVar156._20_4_ = auVar235._20_4_ + auVar125._20_4_;
      auVar156._24_4_ = auVar235._24_4_ + auVar125._24_4_;
      auVar156._28_4_ = auVar235._28_4_ + auVar125._28_4_;
      auVar291 = vcmpps_avx(auVar156,auVar124,2);
      auVar233 = vandps_avx(auVar291,*(undefined1 (*) [32])(auStack_180 + lVar99));
      local_4e0 = auVar233;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar99) & auVar291;
      bVar75 = (auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar76 = (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar74 = (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar73 = SUB321(auVar14 >> 0x7f,0) == '\0';
      bVar72 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar71 = SUB321(auVar14 >> 0xbf,0) == '\0';
      bVar69 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar68 = -1 < auVar14[0x1f];
      if (((((((!bVar75 || !bVar76) || !bVar74) || !bVar73) || !bVar72) || !bVar71) || !bVar69) ||
          !bVar68) {
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar125 = vblendvps_avx(auVar207,auVar125,auVar233);
        auVar291 = vshufps_avx(auVar125,auVar125,0xb1);
        auVar291 = vminps_avx(auVar125,auVar291);
        auVar14 = vshufpd_avx(auVar291,auVar291,5);
        auVar14 = vminps_avx(auVar291,auVar14);
        auVar291 = vpermpd_avx2(auVar14,0x4e);
        auVar14 = vminps_avx(auVar14,auVar291);
        auVar125 = vcmpps_avx(auVar125,auVar14,0);
        auVar14 = auVar233 & auVar125;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar233 = vandps_avx(auVar125,auVar233);
        }
        fVar209 = afStack_140[uVar97 * 0x18 + 1];
        uVar102 = (ulong)auStack_138[uVar97 * 0x18];
        uVar96 = vmovmskps_avx(auVar233);
        iVar18 = 0;
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        fVar221 = afStack_140[uVar97 * 0x18];
        auVar157._4_4_ = fVar221;
        auVar157._0_4_ = fVar221;
        auVar157._8_4_ = fVar221;
        auVar157._12_4_ = fVar221;
        auVar157._16_4_ = fVar221;
        auVar157._20_4_ = fVar221;
        auVar157._24_4_ = fVar221;
        auVar157._28_4_ = fVar221;
        *(undefined4 *)(local_4e0 + (uint)(iVar18 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar99) = local_4e0;
        if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_4e0 >> 0x7f,0) != '\0') ||
              (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_4e0 >> 0xbf,0) != '\0') ||
            (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_4e0[0x1f] < '\0') {
          uVar97 = uVar103;
        }
        fVar209 = fVar209 - fVar221;
        auVar183._4_4_ = fVar209;
        auVar183._0_4_ = fVar209;
        auVar183._8_4_ = fVar209;
        auVar183._12_4_ = fVar209;
        auVar183._16_4_ = fVar209;
        auVar183._20_4_ = fVar209;
        auVar183._24_4_ = fVar209;
        auVar183._28_4_ = fVar209;
        auVar114 = vfmadd132ps_fma(auVar183,auVar157,_DAT_02020f20);
        _local_520 = ZEXT1632(auVar114);
        local_7e0._8_8_ = 0;
        local_7e0._0_8_ = *(ulong *)(local_520 + (uint)(iVar18 << 2));
      }
      auVar220 = ZEXT3264(auVar291);
      uVar103 = uVar97;
    } while (((((((bVar75 && bVar76) && bVar74) && bVar73) && bVar72) && bVar71) && bVar69) &&
             bVar68);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }